

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.h
# Opt level: O1

void google::protobuf::TestUtil::ExpectAllFieldsSet<edition_unittest::TestAllTypes>
               (TestAllTypes *message)

{
  RepeatedField<int> *this;
  RepeatedField<long> *this_00;
  RepeatedField<unsigned_int> *this_01;
  uint32_t uVar1;
  internal iVar2;
  byte bVar3;
  uint uVar4;
  undefined1 *puVar5;
  ImportMessage *pIVar6;
  PublicImportMessage *pPVar7;
  undefined8 *puVar8;
  const_reference piVar9;
  size_t *psVar10;
  const_reference puVar11;
  const_reference puVar12;
  const_reference pfVar13;
  const_reference pdVar14;
  const_reference pbVar15;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar16;
  Value<google::protobuf::internal::GenericTypeHandler<edition_unittest::TestAllTypes_RepeatedGroup>_>
  *pVVar17;
  Value<google::protobuf::internal::GenericTypeHandler<edition_unittest::TestAllTypes_NestedMessage>_>
  *pVVar18;
  Value<google::protobuf::internal::GenericTypeHandler<edition_unittest::ForeignMessage>_> *pVVar19;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest_import::ImportMessage>_>
  *pVVar20;
  undefined8 *puVar21;
  char *pcVar22;
  char *in_R9;
  pointer *__ptr_36;
  pointer *__ptr;
  bool bVar23;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  AssertHelper local_110;
  undefined1 local_108 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_100;
  undefined1 local_f8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  AssertHelper local_d8;
  RepeatedField<int> *local_d0;
  RepeatedField<int> *local_c8;
  RepeatedField<int> *local_c0;
  RepeatedField<bool> *local_b8;
  RepeatedField<double> *local_b0;
  RepeatedField<float> *local_a8;
  RepeatedField<long> *local_a0;
  RepeatedField<int> *local_98;
  RepeatedField<unsigned_long> *local_90;
  RepeatedField<unsigned_int> *local_88;
  RepeatedField<long> *local_80;
  RepeatedField<int> *local_78;
  RepeatedField<unsigned_long> *local_70;
  RepeatedPtrFieldBase *local_68;
  RepeatedPtrFieldBase *local_60;
  RepeatedPtrFieldBase *local_58;
  RepeatedPtrFieldBase *local_50;
  RepeatedPtrFieldBase *local_48;
  RepeatedPtrFieldBase *local_40;
  RepeatedPtrFieldBase *local_38;
  
  uVar4 = (message->field_0)._impl_._has_bits_.has_bits_[0] & 0x1000;
  local_108[0] = (char)(uVar4 >> 0xc);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (uVar4 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)local_108,
               (AssertionResult *)"message.has_optional_int32()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x700,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_108 + 8),local_100);
  }
  uVar4 = (message->field_0)._impl_._has_bits_.has_bits_[0] & 0x800;
  local_108[0] = (char)(uVar4 >> 0xb);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (uVar4 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)local_108,
               (AssertionResult *)"message.has_optional_int64()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x701,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_108 + 8),local_100);
  }
  uVar4 = (message->field_0)._impl_._has_bits_.has_bits_[0] & 0x2000;
  local_108[0] = (char)(uVar4 >> 0xd);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (uVar4 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)local_108,
               (AssertionResult *)"message.has_optional_uint32()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x702,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_108 + 8),local_100);
  }
  uVar4 = (message->field_0)._impl_._has_bits_.has_bits_[0] & 0x4000;
  local_108[0] = (char)(uVar4 >> 0xe);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (uVar4 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)local_108,
               (AssertionResult *)"message.has_optional_uint64()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x703,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_108 + 8),local_100);
  }
  uVar4 = (message->field_0)._impl_._has_bits_.has_bits_[0] & 0x10000;
  local_108[0] = (char)(uVar4 >> 0x10);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (uVar4 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)local_108,
               (AssertionResult *)"message.has_optional_sint32()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x704,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_108 + 8),local_100);
  }
  uVar4 = (message->field_0)._impl_._has_bits_.has_bits_[0] & 0x8000;
  local_108[0] = (char)(uVar4 >> 0xf);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (uVar4 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)local_108,
               (AssertionResult *)"message.has_optional_sint64()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x705,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_108 + 8),local_100);
  }
  uVar4 = (message->field_0)._impl_._has_bits_.has_bits_[0] & 0x20000;
  local_108[0] = (char)(uVar4 >> 0x11);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (uVar4 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)local_108,
               (AssertionResult *)"message.has_optional_fixed32()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x706,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_108 + 8),local_100);
  }
  uVar4 = (message->field_0)._impl_._has_bits_.has_bits_[0] & 0x40000;
  local_108[0] = (char)(uVar4 >> 0x12);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (uVar4 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)local_108,
               (AssertionResult *)"message.has_optional_fixed64()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x707,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_108 + 8),local_100);
  }
  uVar4 = (message->field_0)._impl_._has_bits_.has_bits_[0] & 0x100000;
  local_108[0] = (char)(uVar4 >> 0x14);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (uVar4 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)local_108,
               (AssertionResult *)"message.has_optional_sfixed32()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x708,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_108 + 8),local_100);
  }
  uVar4 = (message->field_0)._impl_._has_bits_.has_bits_[0] & 0x80000;
  local_108[0] = (char)(uVar4 >> 0x13);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (uVar4 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)local_108,
               (AssertionResult *)"message.has_optional_sfixed64()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x709,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_108 + 8),local_100);
  }
  uVar4 = (message->field_0)._impl_._has_bits_.has_bits_[0] & 0x200000;
  local_108[0] = (char)(uVar4 >> 0x15);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (uVar4 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)local_108,
               (AssertionResult *)"message.has_optional_float()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x70a,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_108 + 8),local_100);
  }
  uVar4 = (message->field_0)._impl_._has_bits_.has_bits_[0] & 0x400000;
  local_108[0] = (char)(uVar4 >> 0x16);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (uVar4 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)local_108,
               (AssertionResult *)"message.has_optional_double()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x70b,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_108 + 8),local_100);
  }
  uVar4 = (message->field_0)._impl_._has_bits_.has_bits_[0] & 0x800000;
  local_108[0] = (char)(uVar4 >> 0x17);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (uVar4 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)local_108,
               (AssertionResult *)"message.has_optional_bool()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x70c,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_108 + 8),local_100);
  }
  bVar3 = *(byte *)&message->field_0 & 1;
  local_108[0] = bVar3;
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar3 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)local_108,
               (AssertionResult *)"message.has_optional_string()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x70d,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_108 + 8),local_100);
  }
  uVar4 = (message->field_0)._impl_._has_bits_.has_bits_[0] & 2;
  local_108[0] = (char)(uVar4 >> 1);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (uVar4 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)local_108,
               (AssertionResult *)"message.has_optional_bytes()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x70e,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_108 + 8),local_100);
  }
  uVar4 = (message->field_0)._impl_._has_bits_.has_bits_[0] & 0x10;
  if ((uVar4 != 0) &&
     ((message->field_0)._impl_.optionalgroup_ == (TestAllTypes_OptionalGroup *)0x0)) {
    protobuf::internal::protobuf_assumption_failed
              ("!value || _impl_.optionalgroup_ != nullptr",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/google/protobuf/edition_unittest.pb.h"
               ,0xa893);
  }
  local_108[0] = (char)(uVar4 >> 4);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (uVar4 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)local_108,
               (AssertionResult *)"message.has_optionalgroup()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x710,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_108 + 8),local_100);
  }
  uVar4 = (message->field_0)._impl_._has_bits_.has_bits_[0] & 0x20;
  if ((uVar4 != 0) &&
     ((message->field_0)._impl_.optional_nested_message_ == (TestAllTypes_NestedMessage *)0x0)) {
    protobuf::internal::protobuf_assumption_failed
              ("!value || _impl_.optional_nested_message_ != nullptr",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/google/protobuf/edition_unittest.pb.h"
               ,0xa8f5);
  }
  local_108[0] = (char)(uVar4 >> 5);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (uVar4 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)local_108,
               (AssertionResult *)"message.has_optional_nested_message()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x711,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_108 + 8),local_100);
  }
  uVar4 = (message->field_0)._impl_._has_bits_.has_bits_[0] & 0x40;
  if ((uVar4 != 0) && ((message->field_0)._impl_.optional_foreign_message_ == (ForeignMessage *)0x0)
     ) {
    protobuf::internal::protobuf_assumption_failed
              ("!value || _impl_.optional_foreign_message_ != nullptr",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/google/protobuf/edition_unittest.pb.h"
               ,0xa957);
  }
  local_108[0] = (char)(uVar4 >> 6);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (uVar4 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)local_108,
               (AssertionResult *)"message.has_optional_foreign_message()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x712,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_108 + 8),local_100);
  }
  bVar3 = (byte)(message->field_0)._impl_._has_bits_.has_bits_[0];
  if (((char)bVar3 < '\0') &&
     ((message->field_0)._impl_.optional_import_message_ == (ImportMessage *)0x0)) {
    protobuf::internal::protobuf_assumption_failed
              ("!value || _impl_.optional_import_message_ != nullptr",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/google/protobuf/edition_unittest.pb.h"
               ,0xa9b9);
  }
  local_108[0] = bVar3 >> 7;
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (-1 < (char)bVar3) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)local_108,
               (AssertionResult *)"message.has_optional_import_message()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x713,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_108 + 8),local_100);
  }
  uVar4 = (message->field_0)._impl_._has_bits_.has_bits_[0] & 0x100;
  if ((uVar4 != 0) &&
     ((message->field_0)._impl_.optional_public_import_message_ == (PublicImportMessage *)0x0)) {
    protobuf::internal::protobuf_assumption_failed
              ("!value || _impl_.optional_public_import_message_ != nullptr",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/google/protobuf/edition_unittest.pb.h"
               ,0xaafe);
  }
  local_108[0] = (char)(uVar4 >> 8);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (uVar4 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)local_108,
               (AssertionResult *)"message.has_optional_public_import_message()","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x714,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_108 + 8),local_100);
  }
  uVar4 = (message->field_0)._impl_._has_bits_.has_bits_[0] & 0x200;
  if ((uVar4 != 0) &&
     ((message->field_0)._impl_.optional_lazy_message_ == (TestAllTypes_NestedMessage *)0x0)) {
    protobuf::internal::protobuf_assumption_failed
              ("!value || _impl_.optional_lazy_message_ != nullptr",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/google/protobuf/edition_unittest.pb.h"
               ,0xab5b);
  }
  local_108[0] = (char)(uVar4 >> 9);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (uVar4 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)local_108,
               (AssertionResult *)"message.has_optional_lazy_message()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x715,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_108 + 8),local_100);
  }
  uVar4 = (message->field_0)._impl_._has_bits_.has_bits_[0] & 0x400;
  if ((uVar4 != 0) &&
     ((message->field_0)._impl_.optional_unverified_lazy_message_ ==
      (TestAllTypes_NestedMessage *)0x0)) {
    protobuf::internal::protobuf_assumption_failed
              ("!value || _impl_.optional_unverified_lazy_message_ != nullptr",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/google/protobuf/edition_unittest.pb.h"
               ,0xabbd);
  }
  local_108[0] = (char)(uVar4 >> 10);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (uVar4 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)local_108,
               (AssertionResult *)"message.has_optional_unverified_lazy_message()","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x716,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_108 + 8),local_100);
  }
  puVar5 = (undefined1 *)(message->field_0)._impl_.optionalgroup_;
  if ((TestAllTypes_OptionalGroup *)puVar5 == (TestAllTypes_OptionalGroup *)0x0) {
    puVar5 = edition_unittest::_TestAllTypes_OptionalGroup_default_instance_;
  }
  bVar3 = *(byte *)&((TestAllTypes_OptionalGroup *)puVar5)->field_0 & 1;
  local_108[0] = bVar3;
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar3 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)local_108,
               (AssertionResult *)"message.optionalgroup().has_a()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x718,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_108 + 8),local_100);
  }
  puVar5 = (undefined1 *)(message->field_0)._impl_.optional_nested_message_;
  if ((TestAllTypes_NestedMessage *)puVar5 == (TestAllTypes_NestedMessage *)0x0) {
    puVar5 = edition_unittest::_TestAllTypes_NestedMessage_default_instance_;
  }
  bVar3 = *(byte *)&((TestAllTypes_NestedMessage *)puVar5)->field_0 & 1;
  local_108[0] = bVar3;
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar3 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)local_108,
               (AssertionResult *)"message.optional_nested_message().has_bb()","false","true",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x719,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_108 + 8),local_100);
  }
  puVar5 = (undefined1 *)(message->field_0)._impl_.optional_foreign_message_;
  if ((ForeignMessage *)puVar5 == (ForeignMessage *)0x0) {
    puVar5 = edition_unittest::_ForeignMessage_default_instance_;
  }
  bVar3 = *(byte *)&((ForeignMessage *)puVar5)->field_0 & 1;
  local_108[0] = bVar3;
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar3 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)local_108,
               (AssertionResult *)"message.optional_foreign_message().has_c()","false","true",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x71a,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_108 + 8),local_100);
  }
  pIVar6 = (message->field_0)._impl_.optional_import_message_;
  if (pIVar6 == (ImportMessage *)0x0) {
    pIVar6 = (ImportMessage *)&proto2_unittest_import::_ImportMessage_default_instance_;
  }
  bVar3 = *(byte *)&pIVar6->field_0 & 1;
  local_108[0] = bVar3;
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar3 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)local_108,
               (AssertionResult *)"message.optional_import_message().has_d()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x71b,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_108 + 8),local_100);
  }
  pPVar7 = (message->field_0)._impl_.optional_public_import_message_;
  if (pPVar7 == (PublicImportMessage *)0x0) {
    pPVar7 = (PublicImportMessage *)&proto2_unittest_import::_PublicImportMessage_default_instance_;
  }
  bVar3 = *(byte *)&pPVar7->field_0 & 1;
  local_108[0] = bVar3;
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar3 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)local_108,
               (AssertionResult *)"message.optional_public_import_message().has_e()","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x71c,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_108 + 8),local_100);
  }
  puVar5 = (undefined1 *)(message->field_0)._impl_.optional_lazy_message_;
  if ((TestAllTypes_NestedMessage *)puVar5 == (TestAllTypes_NestedMessage *)0x0) {
    puVar5 = edition_unittest::_TestAllTypes_NestedMessage_default_instance_;
  }
  bVar3 = *(byte *)&((TestAllTypes_NestedMessage *)puVar5)->field_0 & 1;
  local_108[0] = bVar3;
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar3 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)local_108,
               (AssertionResult *)"message.optional_lazy_message().has_bb()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x71d,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_108 + 8),local_100);
  }
  puVar5 = (undefined1 *)(message->field_0)._impl_.optional_unverified_lazy_message_;
  if ((TestAllTypes_NestedMessage *)puVar5 == (TestAllTypes_NestedMessage *)0x0) {
    puVar5 = edition_unittest::_TestAllTypes_NestedMessage_default_instance_;
  }
  bVar3 = *(byte *)&((TestAllTypes_NestedMessage *)puVar5)->field_0 & 1;
  local_108[0] = bVar3;
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar3 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)local_108,
               (AssertionResult *)"message.optional_unverified_lazy_message().has_bb()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x71e,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_108 + 8),local_100);
  }
  uVar4 = (message->field_0)._impl_._has_bits_.has_bits_[0] & 0x2000000;
  local_108[0] = (byte)(uVar4 >> 0x19);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (uVar4 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)local_108,
               (AssertionResult *)"message.has_optional_nested_enum()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x720,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_108 + 8),local_100);
  }
  uVar4 = (message->field_0)._impl_._has_bits_.has_bits_[0] & 0x4000000;
  local_108[0] = (byte)(uVar4 >> 0x1a);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (uVar4 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)local_108,
               (AssertionResult *)"message.has_optional_foreign_enum()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x721,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_108 + 8),local_100);
  }
  uVar4 = (message->field_0)._impl_._has_bits_.has_bits_[0] & 0x1000000;
  local_108[0] = (char)(uVar4 >> 0x18);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (uVar4 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)local_108,
               (AssertionResult *)"message.has_optional_import_enum()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x722,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_108 + 8),local_100);
  }
  uVar4 = (message->field_0)._impl_._has_bits_.has_bits_[0] & 4;
  local_108[0] = (char)(uVar4 >> 2);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (uVar4 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)local_108,
               (AssertionResult *)"message.has_optional_string_piece()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x725,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_108 + 8),local_100);
  }
  uVar4 = (message->field_0)._impl_._has_bits_.has_bits_[0] & 8;
  local_108[0] = (char)(uVar4 >> 3);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (uVar4 == 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)local_108,
               (AssertionResult *)"message.has_optional_cord()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x726,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_108 + 8),local_100);
  }
  uVar1 = (message->field_0)._impl_._has_bits_.has_bits_[0];
  local_108[0] = (byte)(uVar1 >> 0x1f);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (-1 < (int)uVar1) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)local_108,
               (AssertionResult *)"message.has_optional_bytes_cord()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x728,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_108 + 8),local_100);
  }
  local_108._0_4_ = 0x65;
  local_110.data_._0_4_ = (float)(message->field_0)._impl_.optional_int32_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_f8,"101","message.optional_int32()",(int *)local_108,
             (int *)&local_110);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_108);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar22 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar22 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x72a,pcVar22);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_108 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_108 + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_110.data_._0_4_ = 1.42932e-43;
  local_108 = (undefined1  [8])(message->field_0)._impl_.optional_int64_;
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_f8,"102","message.optional_int64()",(int *)&local_110,
             (long *)local_108);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_108);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar22 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar22 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x72b,pcVar22);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_108 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_108 + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_108._0_4_ = 0x67;
  local_110.data_._0_4_ = (float)(message->field_0)._impl_.optional_uint32_;
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)local_f8,"103","message.optional_uint32()",(int *)local_108,
             (uint *)&local_110);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_108);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar22 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar22 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x72c,pcVar22);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_108 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_108 + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_110.data_._0_4_ = 1.45735e-43;
  local_108 = (undefined1  [8])(message->field_0)._impl_.optional_uint64_;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_f8,"104","message.optional_uint64()",(int *)&local_110,
             (unsigned_long *)local_108);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_108);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar22 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar22 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x72d,pcVar22);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_108 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_108 + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_108._0_4_ = 0x69;
  local_110.data_._0_4_ = (float)(message->field_0)._impl_.optional_sint32_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_f8,"105","message.optional_sint32()",(int *)local_108,
             (int *)&local_110);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_108);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar22 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar22 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x72e,pcVar22);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_108 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_108 + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_110.data_._0_4_ = 1.48538e-43;
  local_108 = (undefined1  [8])(message->field_0)._impl_.optional_sint64_;
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_f8,"106","message.optional_sint64()",(int *)&local_110,
             (long *)local_108);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_108);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar22 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar22 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x72f,pcVar22);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_108 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_108 + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_108._0_4_ = 0x6b;
  local_110.data_._0_4_ = (float)(message->field_0)._impl_.optional_fixed32_;
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)local_f8,"107","message.optional_fixed32()",(int *)local_108,
             (uint *)&local_110);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_108);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar22 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar22 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x730,pcVar22);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_108 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_108 + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_110.data_._0_4_ = 1.5134e-43;
  local_108 = (undefined1  [8])(message->field_0)._impl_.optional_fixed64_;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_f8,"108","message.optional_fixed64()",(int *)&local_110,
             (unsigned_long *)local_108);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_108);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar22 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar22 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x731,pcVar22);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_108 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_108 + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_108._0_4_ = 0x6d;
  local_110.data_._0_4_ = (float)(message->field_0)._impl_.optional_sfixed32_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_f8,"109","message.optional_sfixed32()",(int *)local_108,
             (int *)&local_110);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_108);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar22 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar22 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x732,pcVar22);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_108 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_108 + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_110.data_._0_4_ = 1.54143e-43;
  local_108 = (undefined1  [8])(message->field_0)._impl_.optional_sfixed64_;
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_f8,"110","message.optional_sfixed64()",(int *)&local_110,
             (long *)local_108);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_108);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar22 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar22 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x733,pcVar22);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_108 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_108 + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_108._0_4_ = 0x6f;
  local_110.data_._0_4_ = (message->field_0)._impl_.optional_float_;
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)local_f8,"111","message.optional_float()",(int *)local_108,
             (float *)&local_110);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_108);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar22 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar22 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x734,pcVar22);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_108 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_108 + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_110.data_._0_4_ = 1.56945e-43;
  local_108 = (undefined1  [8])(message->field_0)._impl_.optional_double_;
  testing::internal::CmpHelperEQ<int,double>
            ((internal *)local_f8,"112","message.optional_double()",(int *)&local_110,
             (double *)local_108);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_108);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar22 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar22 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x735,pcVar22);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_108 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_108 + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  bVar23 = (message->field_0)._impl_.optional_bool_;
  local_108[0] = bVar23;
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar23 == false) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)local_108,(AssertionResult *)"message.optional_bool()"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x736,(char *)CONCAT71(local_f8._1_7_,local_f8[0]));
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_f8._1_7_,local_f8[0]) != &local_e8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_f8._1_7_,local_f8[0]),local_e8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_110.data_._4_4_,local_110.data_._0_4_) + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_108 + 8),local_100);
  }
  puVar8 = (undefined8 *)
           ((ulong)(message->field_0)._impl_.optional_string_.tagged_ptr_.ptr_ & 0xfffffffffffffffc)
  ;
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar8;
  local_108 = (undefined1  [8])puVar8[1];
  testing::internal::CmpHelperEQ<char[4],std::basic_string_view<char,std::char_traits<char>>>
            ((internal *)local_f8,"\"115\"","message.optional_string()",(char (*) [4])"115",
             (basic_string_view<char,_std::char_traits<char>_> *)local_108);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_108);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar22 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar22 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x737,pcVar22);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_108 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_108 + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  puVar8 = (undefined8 *)
           ((ulong)(message->field_0)._impl_.optional_bytes_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar8;
  local_108 = (undefined1  [8])puVar8[1];
  testing::internal::CmpHelperEQ<char[4],std::basic_string_view<char,std::char_traits<char>>>
            ((internal *)local_f8,"\"116\"","message.optional_bytes()",(char (*) [4])"116",
             (basic_string_view<char,_std::char_traits<char>_> *)local_108);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_108);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar22 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar22 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x738,pcVar22);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_108 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_108 + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_108._0_4_ = 0x75;
  puVar5 = (undefined1 *)(message->field_0)._impl_.optionalgroup_;
  if ((TestAllTypes_OptionalGroup *)puVar5 == (TestAllTypes_OptionalGroup *)0x0) {
    puVar5 = edition_unittest::_TestAllTypes_OptionalGroup_default_instance_;
  }
  local_110.data_._0_4_ = (float)(((TestAllTypes_OptionalGroup *)puVar5)->field_0)._impl_.a_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_f8,"117","message.optionalgroup().a()",(int *)local_108,
             (int *)&local_110);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_108);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar22 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar22 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x73a,pcVar22);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_108 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_108 + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_108._0_4_ = 0x76;
  puVar5 = (undefined1 *)(message->field_0)._impl_.optional_nested_message_;
  if ((TestAllTypes_NestedMessage *)puVar5 == (TestAllTypes_NestedMessage *)0x0) {
    puVar5 = edition_unittest::_TestAllTypes_NestedMessage_default_instance_;
  }
  local_110.data_._0_4_ = (float)(((TestAllTypes_NestedMessage *)puVar5)->field_0)._impl_.bb_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_f8,"118","message.optional_nested_message().bb()",(int *)local_108,
             (int *)&local_110);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_108);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar22 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar22 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x73b,pcVar22);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_108 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_108 + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_108._0_4_ = 0x77;
  puVar5 = (undefined1 *)(message->field_0)._impl_.optional_foreign_message_;
  if ((ForeignMessage *)puVar5 == (ForeignMessage *)0x0) {
    puVar5 = edition_unittest::_ForeignMessage_default_instance_;
  }
  local_110.data_._0_4_ = (float)(((ForeignMessage *)puVar5)->field_0)._impl_.c_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_f8,"119","message.optional_foreign_message().c()",(int *)local_108,
             (int *)&local_110);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_108);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar22 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar22 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x73c,pcVar22);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_108 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_108 + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_108._0_4_ = 0x78;
  pIVar6 = (message->field_0)._impl_.optional_import_message_;
  if (pIVar6 == (ImportMessage *)0x0) {
    pIVar6 = (ImportMessage *)&proto2_unittest_import::_ImportMessage_default_instance_;
  }
  local_110.data_._0_4_ = (float)(pIVar6->field_0)._impl_.d_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_f8,"120","message.optional_import_message().d()",(int *)local_108,
             (int *)&local_110);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_108);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar22 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar22 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x73d,pcVar22);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_108 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_108 + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_108._0_4_ = 0x7e;
  pPVar7 = (message->field_0)._impl_.optional_public_import_message_;
  if (pPVar7 == (PublicImportMessage *)0x0) {
    pPVar7 = (PublicImportMessage *)&proto2_unittest_import::_PublicImportMessage_default_instance_;
  }
  local_110.data_._0_4_ = (float)(pPVar7->field_0)._impl_.e_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_f8,"126","message.optional_public_import_message().e()",
             (int *)local_108,(int *)&local_110);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_108);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar22 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar22 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x73e,pcVar22);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_108 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_108 + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_108._0_4_ = 0x7f;
  puVar5 = (undefined1 *)(message->field_0)._impl_.optional_lazy_message_;
  if ((TestAllTypes_NestedMessage *)puVar5 == (TestAllTypes_NestedMessage *)0x0) {
    puVar5 = edition_unittest::_TestAllTypes_NestedMessage_default_instance_;
  }
  local_110.data_._0_4_ = (float)(((TestAllTypes_NestedMessage *)puVar5)->field_0)._impl_.bb_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_f8,"127","message.optional_lazy_message().bb()",(int *)local_108,
             (int *)&local_110);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_108);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar22 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar22 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x73f,pcVar22);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_108 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_108 + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_108._0_4_ = 0x80;
  puVar5 = (undefined1 *)(message->field_0)._impl_.optional_unverified_lazy_message_;
  if ((TestAllTypes_NestedMessage *)puVar5 == (TestAllTypes_NestedMessage *)0x0) {
    puVar5 = edition_unittest::_TestAllTypes_NestedMessage_default_instance_;
  }
  local_110.data_._0_4_ = (float)(((TestAllTypes_NestedMessage *)puVar5)->field_0)._impl_.bb_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_f8,"128","message.optional_unverified_lazy_message().bb()",
             (int *)local_108,(int *)&local_110);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_108);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar22 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar22 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x740,pcVar22);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_108 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_108 + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_108._0_4_ = (message->field_0)._impl_.optional_nested_enum_;
  testing::internal::
  CmpHelperEQ<edition_unittest::TestAllTypes_NestedEnum,edition_unittest::TestAllTypes_NestedEnum>
            ((internal *)local_f8,"TestAllTypes::BAZ","message.optional_nested_enum()",
             &edition_unittest::TestAllTypes::BAZ,(TestAllTypes_NestedEnum *)local_108);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_108);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar22 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar22 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x742,pcVar22);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_108 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_108 + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_108._0_4_ = 6;
  local_110.data_._0_4_ = (float)(message->field_0)._impl_.optional_foreign_enum_;
  testing::internal::CmpHelperEQ<edition_unittest::ForeignEnum,edition_unittest::ForeignEnum>
            ((internal *)local_f8,"ForeignEnum<TestAllTypes>::FOREIGN_BAZ",
             "message.optional_foreign_enum()",(ForeignEnum *)local_108,(ForeignEnum *)&local_110);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_108);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar22 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar22 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x744,pcVar22);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_108 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_108 + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_108._0_4_ = 9;
  local_110.data_._0_4_ = (float)(message->field_0)._impl_.optional_import_enum_;
  testing::internal::
  CmpHelperEQ<proto2_unittest_import::ImportEnum,proto2_unittest_import::ImportEnum>
            ((internal *)local_f8,"ImportEnum<TestAllTypes>::IMPORT_BAZ",
             "message.optional_import_enum()",(ImportEnum *)local_108,(ImportEnum *)&local_110);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_108);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar22 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar22 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x746,pcVar22);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_108 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_108 + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  testing::internal::CmpHelperEQ<char[20],absl::lts_20250127::Cord>
            ((internal *)local_f8,"\"optional bytes cord\"","message.optional_bytes_cord()",
             (char (*) [20])"optional bytes cord",&(message->field_0)._impl_.optional_bytes_cord_);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_108);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar22 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar22 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x748,pcVar22);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_108 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_108 + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  local_108._0_4_ = 2;
  this = &(message->field_0)._impl_.repeated_int32_;
  local_110.data_._0_4_ =
       (float)protobuf::internal::SooRep::size
                        (&this->soo_rep_,
                         (undefined1  [888])
                         ((undefined1  [888])message->field_0 & (undefined1  [888])0x4) ==
                         (undefined1  [888])0x0);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_f8,"2","message.repeated_int32_size()",(int *)local_108,
             (int *)&local_110);
  iVar2 = local_f8[0];
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_108);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar22 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar22 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x74c,pcVar22);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_108 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_108 + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  if (iVar2 != (internal)0x0) {
    local_108._0_4_ = 2;
    this_00 = &(message->field_0)._impl_.repeated_int64_;
    local_110.data_._0_4_ =
         (float)protobuf::internal::SooRep::size
                          (&this_00->soo_rep_,(*(byte *)((long)&message->field_0 + 0x28) & 4) == 0);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_f8,"2","message.repeated_int64_size()",(int *)local_108,
               (int *)&local_110);
    iVar2 = local_f8[0];
    if (local_f8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_108);
      if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar22 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar22 = (local_f0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_110,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0x74d,pcVar22);
      testing::internal::AssertHelper::operator=(&local_110,(Message *)local_108);
      testing::internal::AssertHelper::~AssertHelper(&local_110);
      if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
           )local_108 !=
          (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        (**(code **)(*(long *)local_108 + 8))();
      }
    }
    if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_f0,local_f0);
    }
    if (iVar2 != (internal)0x0) {
      local_108._0_4_ = 2;
      this_01 = &(message->field_0)._impl_.repeated_uint32_;
      local_110.data_._0_4_ =
           (float)protobuf::internal::SooRep::size
                            (&this_01->soo_rep_,(*(byte *)((long)&message->field_0 + 0x40) & 4) == 0
                            );
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_f8,"2","message.repeated_uint32_size()",(int *)local_108,
                 (int *)&local_110);
      iVar2 = local_f8[0];
      if (local_f8[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_108);
        if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar22 = anon_var_dwarf_a12c75 + 5;
        }
        else {
          pcVar22 = (local_f0->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_110,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                   ,0x74e,pcVar22);
        testing::internal::AssertHelper::operator=(&local_110,(Message *)local_108);
        testing::internal::AssertHelper::~AssertHelper(&local_110);
        if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
             )local_108 !=
            (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          (**(code **)(*(long *)local_108 + 8))();
        }
      }
      if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_f0,local_f0);
      }
      if (iVar2 != (internal)0x0) {
        local_108._0_4_ = 2;
        local_70 = &(message->field_0)._impl_.repeated_uint64_;
        local_110.data_._0_4_ =
             (float)protobuf::internal::SooRep::size
                              (&local_70->soo_rep_,
                               (*(byte *)((long)&message->field_0 + 0x58) & 4) == 0);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_f8,"2","message.repeated_uint64_size()",(int *)local_108,
                   (int *)&local_110);
        iVar2 = local_f8[0];
        if (local_f8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_108);
          if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar22 = anon_var_dwarf_a12c75 + 5;
          }
          else {
            pcVar22 = (local_f0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_110,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                     ,0x74f,pcVar22);
          testing::internal::AssertHelper::operator=(&local_110,(Message *)local_108);
          testing::internal::AssertHelper::~AssertHelper(&local_110);
          if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
               )local_108 !=
              (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            (**(code **)(*(long *)local_108 + 8))();
          }
        }
        if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_f0,local_f0);
        }
        if (iVar2 != (internal)0x0) {
          local_108._0_4_ = 2;
          local_78 = &(message->field_0)._impl_.repeated_sint32_;
          local_110.data_._0_4_ =
               (float)protobuf::internal::SooRep::size
                                (&local_78->soo_rep_,
                                 (*(byte *)((long)&message->field_0 + 0x70) & 4) == 0);
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)local_f8,"2","message.repeated_sint32_size()",(int *)local_108,
                     (int *)&local_110);
          iVar2 = local_f8[0];
          if (local_f8[0] == (internal)0x0) {
            testing::Message::Message((Message *)local_108);
            if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              pcVar22 = anon_var_dwarf_a12c75 + 5;
            }
            else {
              pcVar22 = (local_f0->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_110,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                       ,0x750,pcVar22);
            testing::internal::AssertHelper::operator=(&local_110,(Message *)local_108);
            testing::internal::AssertHelper::~AssertHelper(&local_110);
            if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                 )local_108 !=
                (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              (**(code **)(*(long *)local_108 + 8))();
            }
          }
          if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_f0,local_f0);
          }
          if (iVar2 != (internal)0x0) {
            local_108._0_4_ = 2;
            local_80 = &(message->field_0)._impl_.repeated_sint64_;
            local_110.data_._0_4_ =
                 (float)protobuf::internal::SooRep::size
                                  (&local_80->soo_rep_,
                                   (*(byte *)((long)&message->field_0 + 0x88) & 4) == 0);
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)local_f8,"2","message.repeated_sint64_size()",(int *)local_108,
                       (int *)&local_110);
            iVar2 = local_f8[0];
            if (local_f8[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_108);
              if (local_f0 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar22 = anon_var_dwarf_a12c75 + 5;
              }
              else {
                pcVar22 = (local_f0->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_110,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                         ,0x751,pcVar22);
              testing::internal::AssertHelper::operator=(&local_110,(Message *)local_108);
              testing::internal::AssertHelper::~AssertHelper(&local_110);
              if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                   )local_108 !=
                  (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )0x0) {
                (**(code **)(*(long *)local_108 + 8))();
              }
            }
            if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_f0,local_f0);
            }
            if (iVar2 != (internal)0x0) {
              local_108._0_4_ = 2;
              local_88 = &(message->field_0)._impl_.repeated_fixed32_;
              local_110.data_._0_4_ =
                   (float)protobuf::internal::SooRep::size
                                    (&local_88->soo_rep_,
                                     (*(byte *)((long)&message->field_0 + 0xa0) & 4) == 0);
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)local_f8,"2","message.repeated_fixed32_size()",(int *)local_108
                         ,(int *)&local_110);
              iVar2 = local_f8[0];
              if (local_f8[0] == (internal)0x0) {
                testing::Message::Message((Message *)local_108);
                if (local_f0 ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar22 = anon_var_dwarf_a12c75 + 5;
                }
                else {
                  pcVar22 = (local_f0->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_110,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                           ,0x752,pcVar22);
                testing::internal::AssertHelper::operator=(&local_110,(Message *)local_108);
                testing::internal::AssertHelper::~AssertHelper(&local_110);
                if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                     )local_108 !=
                    (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )0x0) {
                  (**(code **)(*(long *)local_108 + 8))();
                }
              }
              if (local_f0 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_f0,local_f0);
              }
              if (iVar2 != (internal)0x0) {
                local_108._0_4_ = 2;
                local_90 = &(message->field_0)._impl_.repeated_fixed64_;
                local_110.data_._0_4_ =
                     (float)protobuf::internal::SooRep::size
                                      (&local_90->soo_rep_,
                                       (*(byte *)((long)&message->field_0 + 0xb0) & 4) == 0);
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)local_f8,"2","message.repeated_fixed64_size()",
                           (int *)local_108,(int *)&local_110);
                iVar2 = local_f8[0];
                if (local_f8[0] == (internal)0x0) {
                  testing::Message::Message((Message *)local_108);
                  if (local_f0 ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                  }
                  else {
                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_110,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                             ,0x753,pcVar22);
                  testing::internal::AssertHelper::operator=(&local_110,(Message *)local_108);
                  testing::internal::AssertHelper::~AssertHelper(&local_110);
                  if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                       )local_108 !=
                      (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )0x0) {
                    (**(code **)(*(long *)local_108 + 8))();
                  }
                }
                if (local_f0 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_f0,local_f0);
                }
                if (iVar2 != (internal)0x0) {
                  local_108._0_4_ = 2;
                  local_98 = &(message->field_0)._impl_.repeated_sfixed32_;
                  local_110.data_._0_4_ =
                       (float)protobuf::internal::SooRep::size
                                        (&local_98->soo_rep_,
                                         (*(byte *)((long)&message->field_0 + 0xc0) & 4) == 0);
                  testing::internal::CmpHelperEQ<int,int>
                            ((internal *)local_f8,"2","message.repeated_sfixed32_size()",
                             (int *)local_108,(int *)&local_110);
                  iVar2 = local_f8[0];
                  if (local_f8[0] == (internal)0x0) {
                    testing::Message::Message((Message *)local_108);
                    if (local_f0 ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar22 = anon_var_dwarf_a12c75 + 5;
                    }
                    else {
                      pcVar22 = (local_f0->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_110,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                               ,0x754,pcVar22);
                    testing::internal::AssertHelper::operator=(&local_110,(Message *)local_108);
                    testing::internal::AssertHelper::~AssertHelper(&local_110);
                    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                         )local_108 !=
                        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )0x0) {
                      (**(code **)(*(long *)local_108 + 8))();
                    }
                  }
                  if (local_f0 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_f0,local_f0);
                  }
                  if (iVar2 != (internal)0x0) {
                    local_108._0_4_ = 2;
                    local_a0 = &(message->field_0)._impl_.repeated_sfixed64_;
                    local_110.data_._0_4_ =
                         (float)protobuf::internal::SooRep::size
                                          (&local_a0->soo_rep_,
                                           (*(byte *)((long)&message->field_0 + 0xd0) & 4) == 0);
                    testing::internal::CmpHelperEQ<int,int>
                              ((internal *)local_f8,"2","message.repeated_sfixed64_size()",
                               (int *)local_108,(int *)&local_110);
                    iVar2 = local_f8[0];
                    if (local_f8[0] == (internal)0x0) {
                      testing::Message::Message((Message *)local_108);
                      if (local_f0 ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pcVar22 = anon_var_dwarf_a12c75 + 5;
                      }
                      else {
                        pcVar22 = (local_f0->_M_dataplus)._M_p;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                (&local_110,kFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                 ,0x755,pcVar22);
                      testing::internal::AssertHelper::operator=(&local_110,(Message *)local_108);
                      testing::internal::AssertHelper::~AssertHelper(&local_110);
                      if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                           )local_108 !=
                          (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )0x0) {
                        (**(code **)(*(long *)local_108 + 8))();
                      }
                    }
                    if (local_f0 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_f0,local_f0);
                    }
                    if (iVar2 != (internal)0x0) {
                      local_108._0_4_ = 2;
                      local_a8 = &(message->field_0)._impl_.repeated_float_;
                      local_110.data_._0_4_ =
                           (float)protobuf::internal::SooRep::size
                                            (&local_a8->soo_rep_,
                                             (*(byte *)((long)&message->field_0 + 0xe0) & 4) == 0);
                      testing::internal::CmpHelperEQ<int,int>
                                ((internal *)local_f8,"2","message.repeated_float_size()",
                                 (int *)local_108,(int *)&local_110);
                      iVar2 = local_f8[0];
                      if (local_f8[0] == (internal)0x0) {
                        testing::Message::Message((Message *)local_108);
                        if (local_f0 ==
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          pcVar22 = anon_var_dwarf_a12c75 + 5;
                        }
                        else {
                          pcVar22 = (local_f0->_M_dataplus)._M_p;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_110,kFatalFailure,
                                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                   ,0x756,pcVar22);
                        testing::internal::AssertHelper::operator=(&local_110,(Message *)local_108);
                        testing::internal::AssertHelper::~AssertHelper(&local_110);
                        if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                             )local_108 !=
                            (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )0x0) {
                          (**(code **)(*(long *)local_108 + 8))();
                        }
                      }
                      if (local_f0 !=
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        std::
                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&local_f0,local_f0);
                      }
                      if (iVar2 != (internal)0x0) {
                        local_108._0_4_ = 2;
                        local_b0 = &(message->field_0)._impl_.repeated_double_;
                        local_110.data_._0_4_ =
                             (float)protobuf::internal::SooRep::size
                                              (&local_b0->soo_rep_,
                                               (*(byte *)((long)&message->field_0 + 0xf0) & 4) == 0)
                        ;
                        testing::internal::CmpHelperEQ<int,int>
                                  ((internal *)local_f8,"2","message.repeated_double_size()",
                                   (int *)local_108,(int *)&local_110);
                        iVar2 = local_f8[0];
                        if (local_f8[0] == (internal)0x0) {
                          testing::Message::Message((Message *)local_108);
                          if (local_f0 ==
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            pcVar22 = anon_var_dwarf_a12c75 + 5;
                          }
                          else {
                            pcVar22 = (local_f0->_M_dataplus)._M_p;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_110,kFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                     ,0x757,pcVar22);
                          testing::internal::AssertHelper::operator=
                                    (&local_110,(Message *)local_108);
                          testing::internal::AssertHelper::~AssertHelper(&local_110);
                          if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                               )local_108 !=
                              (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )0x0) {
                            (**(code **)(*(long *)local_108 + 8))();
                          }
                        }
                        if (local_f0 !=
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          std::
                          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&local_f0,local_f0);
                        }
                        if (iVar2 != (internal)0x0) {
                          local_108._0_4_ = 2;
                          local_b8 = &(message->field_0)._impl_.repeated_bool_;
                          local_110.data_._0_4_ =
                               (float)protobuf::internal::SooRep::size
                                                (&local_b8->soo_rep_,
                                                 (*(byte *)((long)&message->field_0 + 0x100) & 4) ==
                                                 0);
                          testing::internal::CmpHelperEQ<int,int>
                                    ((internal *)local_f8,"2","message.repeated_bool_size()",
                                     (int *)local_108,(int *)&local_110);
                          iVar2 = local_f8[0];
                          if (local_f8[0] == (internal)0x0) {
                            testing::Message::Message((Message *)local_108);
                            if (local_f0 ==
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              pcVar22 = anon_var_dwarf_a12c75 + 5;
                            }
                            else {
                              pcVar22 = (local_f0->_M_dataplus)._M_p;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_110,kFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                       ,0x758,pcVar22);
                            testing::internal::AssertHelper::operator=
                                      (&local_110,(Message *)local_108);
                            testing::internal::AssertHelper::~AssertHelper(&local_110);
                            if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                 )local_108 !=
                                (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )0x0) {
                              (**(code **)(*(long *)local_108 + 8))();
                            }
                          }
                          if (local_f0 !=
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            std::
                            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_f0,local_f0);
                          }
                          if (iVar2 != (internal)0x0) {
                            local_108._0_4_ = 2;
                            local_110.data_._0_4_ = *(float *)((long)&message->field_0 + 0x118);
                            testing::internal::CmpHelperEQ<int,int>
                                      ((internal *)local_f8,"2","message.repeated_string_size()",
                                       (int *)local_108,(int *)&local_110);
                            iVar2 = local_f8[0];
                            if (local_f8[0] == (internal)0x0) {
                              testing::Message::Message((Message *)local_108);
                              if (local_f0 ==
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                pcVar22 = anon_var_dwarf_a12c75 + 5;
                              }
                              else {
                                pcVar22 = (local_f0->_M_dataplus)._M_p;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_110,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                         ,0x759,pcVar22);
                              testing::internal::AssertHelper::operator=
                                        (&local_110,(Message *)local_108);
                              testing::internal::AssertHelper::~AssertHelper(&local_110);
                              if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                   )local_108 !=
                                  (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )0x0) {
                                (**(code **)(*(long *)local_108 + 8))();
                              }
                            }
                            if (local_f0 !=
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              std::
                              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)&local_f0,local_f0);
                            }
                            if (iVar2 != (internal)0x0) {
                              local_108._0_4_ = 2;
                              local_110.data_._0_4_ = *(float *)((long)&message->field_0 + 0x130);
                              testing::internal::CmpHelperEQ<int,int>
                                        ((internal *)local_f8,"2","message.repeated_bytes_size()",
                                         (int *)local_108,(int *)&local_110);
                              iVar2 = local_f8[0];
                              if (local_f8[0] == (internal)0x0) {
                                testing::Message::Message((Message *)local_108);
                                if (local_f0 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar22 = anon_var_dwarf_a12c75 + 5;
                                }
                                else {
                                  pcVar22 = (local_f0->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_110,kFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                           ,0x75a,pcVar22);
                                testing::internal::AssertHelper::operator=
                                          (&local_110,(Message *)local_108);
                                testing::internal::AssertHelper::~AssertHelper(&local_110);
                                if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                     )local_108 !=
                                    (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )0x0) {
                                  (**(code **)(*(long *)local_108 + 8))();
                                }
                              }
                              if (local_f0 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_f0,local_f0);
                              }
                              if (iVar2 != (internal)0x0) {
                                local_108._0_4_ = 2;
                                local_110.data_._0_4_ = *(float *)((long)&message->field_0 + 0x148);
                                testing::internal::CmpHelperEQ<int,int>
                                          ((internal *)local_f8,"2","message.repeatedgroup_size()",
                                           (int *)local_108,(int *)&local_110);
                                iVar2 = local_f8[0];
                                if (local_f8[0] == (internal)0x0) {
                                  testing::Message::Message((Message *)local_108);
                                  if (local_f0 ==
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0) {
                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                  }
                                  else {
                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                  }
                                  testing::internal::AssertHelper::AssertHelper
                                            (&local_110,kFatalFailure,
                                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                             ,0x75c,pcVar22);
                                  testing::internal::AssertHelper::operator=
                                            (&local_110,(Message *)local_108);
                                  testing::internal::AssertHelper::~AssertHelper(&local_110);
                                  if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                       )local_108 !=
                                      (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )0x0) {
                                    (**(code **)(*(long *)local_108 + 8))();
                                  }
                                }
                                if (local_f0 !=
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  std::
                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)&local_f0,local_f0);
                                }
                                if (iVar2 != (internal)0x0) {
                                  local_108._0_4_ = 2;
                                  local_110.data_._0_4_ =
                                       *(float *)((long)&message->field_0 + 0x160);
                                  testing::internal::CmpHelperEQ<int,int>
                                            ((internal *)local_f8,"2",
                                             "message.repeated_nested_message_size()",
                                             (int *)local_108,(int *)&local_110);
                                  iVar2 = local_f8[0];
                                  if (local_f8[0] == (internal)0x0) {
                                    testing::Message::Message((Message *)local_108);
                                    if (local_f0 ==
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      pcVar22 = anon_var_dwarf_a12c75 + 5;
                                    }
                                    else {
                                      pcVar22 = (local_f0->_M_dataplus)._M_p;
                                    }
                                    testing::internal::AssertHelper::AssertHelper
                                              (&local_110,kFatalFailure,
                                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                               ,0x75d,pcVar22);
                                    testing::internal::AssertHelper::operator=
                                              (&local_110,(Message *)local_108);
                                    testing::internal::AssertHelper::~AssertHelper(&local_110);
                                    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                         )local_108 !=
                                        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )0x0) {
                                      (**(code **)(*(long *)local_108 + 8))();
                                    }
                                  }
                                  if (local_f0 !=
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0) {
                                    std::
                                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                  }
                                  if (iVar2 != (internal)0x0) {
                                    local_108._0_4_ = 2;
                                    local_110.data_._0_4_ =
                                         *(float *)((long)&message->field_0 + 0x178);
                                    testing::internal::CmpHelperEQ<int,int>
                                              ((internal *)local_f8,"2",
                                               "message.repeated_foreign_message_size()",
                                               (int *)local_108,(int *)&local_110);
                                    iVar2 = local_f8[0];
                                    if (local_f8[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_108);
                                      if (local_f0 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar22 = anon_var_dwarf_a12c75 + 5;
                                      }
                                      else {
                                        pcVar22 = (local_f0->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_110,kFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                 ,0x75e,pcVar22);
                                      testing::internal::AssertHelper::operator=
                                                (&local_110,(Message *)local_108);
                                      testing::internal::AssertHelper::~AssertHelper(&local_110);
                                      if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                           )local_108 !=
                                          (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        (**(code **)(*(long *)local_108 + 8))();
                                      }
                                    }
                                    if (local_f0 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                    }
                                    if (iVar2 != (internal)0x0) {
                                      local_108._0_4_ = 2;
                                      local_110.data_._0_4_ =
                                           *(float *)((long)&message->field_0 + 400);
                                      testing::internal::CmpHelperEQ<int,int>
                                                ((internal *)local_f8,"2",
                                                 "message.repeated_import_message_size()",
                                                 (int *)local_108,(int *)&local_110);
                                      iVar2 = local_f8[0];
                                      if (local_f8[0] == (internal)0x0) {
                                        testing::Message::Message((Message *)local_108);
                                        if (local_f0 ==
                                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)0x0) {
                                          pcVar22 = anon_var_dwarf_a12c75 + 5;
                                        }
                                        else {
                                          pcVar22 = (local_f0->_M_dataplus)._M_p;
                                        }
                                        testing::internal::AssertHelper::AssertHelper
                                                  (&local_110,kFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x75f,pcVar22);
                                        testing::internal::AssertHelper::operator=
                                                  (&local_110,(Message *)local_108);
                                        testing::internal::AssertHelper::~AssertHelper(&local_110);
                                        if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                             )local_108 !=
                                            (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )0x0) {
                                          (**(code **)(*(long *)local_108 + 8))();
                                        }
                                      }
                                      if (local_f0 !=
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        std::
                                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                      }
                                      if (iVar2 != (internal)0x0) {
                                        local_108._0_4_ = 2;
                                        local_110.data_._0_4_ =
                                             *(float *)((long)&message->field_0 + 0x220);
                                        testing::internal::CmpHelperEQ<int,int>
                                                  ((internal *)local_f8,"2",
                                                   "message.repeated_lazy_message_size()",
                                                   (int *)local_108,(int *)&local_110);
                                        iVar2 = local_f8[0];
                                        if (local_f8[0] == (internal)0x0) {
                                          testing::Message::Message((Message *)local_108);
                                          if (local_f0 ==
                                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)0x0) {
                                            pcVar22 = anon_var_dwarf_a12c75 + 5;
                                          }
                                          else {
                                            pcVar22 = (local_f0->_M_dataplus)._M_p;
                                          }
                                          testing::internal::AssertHelper::AssertHelper
                                                    (&local_110,kFatalFailure,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x760,pcVar22);
                                          testing::internal::AssertHelper::operator=
                                                    (&local_110,(Message *)local_108);
                                          testing::internal::AssertHelper::~AssertHelper(&local_110)
                                          ;
                                          if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                               )local_108 !=
                                              (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               )0x0) {
                                            (**(code **)(*(long *)local_108 + 8))();
                                          }
                                        }
                                        if (local_f0 !=
                                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)0x0) {
                                          std::
                                          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                        }
                                        if (iVar2 != (internal)0x0) {
                                          local_108._0_4_ = 2;
                                          local_c0 = &(message->field_0)._impl_.
                                                      repeated_nested_enum_;
                                          local_110.data_._0_4_ =
                                               (float)protobuf::internal::SooRep::size
                                                                (&local_c0->soo_rep_,
                                                                 (*(byte *)((long)&message->field_0
                                                                           + 0x1a0) & 4) == 0);
                                          testing::internal::CmpHelperEQ<int,int>
                                                    ((internal *)local_f8,"2",
                                                     "message.repeated_nested_enum_size()",
                                                     (int *)local_108,(int *)&local_110);
                                          iVar2 = local_f8[0];
                                          if (local_f8[0] == (internal)0x0) {
                                            testing::Message::Message((Message *)local_108);
                                            if (local_f0 ==
                                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)0x0) {
                                              pcVar22 = anon_var_dwarf_a12c75 + 5;
                                            }
                                            else {
                                              pcVar22 = (local_f0->_M_dataplus)._M_p;
                                            }
                                            testing::internal::AssertHelper::AssertHelper
                                                      (&local_110,kFatalFailure,
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x761,pcVar22);
                                            testing::internal::AssertHelper::operator=
                                                      (&local_110,(Message *)local_108);
                                            testing::internal::AssertHelper::~AssertHelper
                                                      (&local_110);
                                            if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                 )local_108 !=
                                                (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 )0x0) {
                                              (**(code **)(*(long *)local_108 + 8))();
                                            }
                                          }
                                          if (local_f0 !=
                                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)0x0) {
                                            std::
                                            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                          }
                                          if (iVar2 != (internal)0x0) {
                                            local_108._0_4_ = 2;
                                            local_c8 = &(message->field_0)._impl_.
                                                        repeated_foreign_enum_;
                                            local_110.data_._0_4_ =
                                                 (float)protobuf::internal::SooRep::size
                                                                  (&local_c8->soo_rep_,
                                                                   (*(byte *)((long)&message->
                                                  field_0 + 0x1b8) & 4) == 0);
                                            testing::internal::CmpHelperEQ<int,int>
                                                      ((internal *)local_f8,"2",
                                                       "message.repeated_foreign_enum_size()",
                                                       (int *)local_108,(int *)&local_110);
                                            iVar2 = local_f8[0];
                                            if (local_f8[0] == (internal)0x0) {
                                              testing::Message::Message((Message *)local_108);
                                              if (local_f0 ==
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                pcVar22 = anon_var_dwarf_a12c75 + 5;
                                              }
                                              else {
                                                pcVar22 = (local_f0->_M_dataplus)._M_p;
                                              }
                                              testing::internal::AssertHelper::AssertHelper
                                                        (&local_110,kFatalFailure,
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x762,pcVar22);
                                              testing::internal::AssertHelper::operator=
                                                        (&local_110,(Message *)local_108);
                                              testing::internal::AssertHelper::~AssertHelper
                                                        (&local_110);
                                              if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                (**(code **)(*(long *)local_108 + 8))();
                                              }
                                            }
                                            if (local_f0 !=
                                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)0x0) {
                                              std::
                                              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                            }
                                            if (iVar2 != (internal)0x0) {
                                              local_108._0_4_ = 2;
                                              local_d0 = &(message->field_0)._impl_.
                                                          repeated_import_enum_;
                                              local_110.data_._0_4_ =
                                                   (float)protobuf::internal::SooRep::size
                                                                    (&local_d0->soo_rep_,
                                                                     (*(byte *)((long)&message->
                                                  field_0 + 0x1d0) & 4) == 0);
                                              testing::internal::CmpHelperEQ<int,int>
                                                        ((internal *)local_f8,"2",
                                                         "message.repeated_import_enum_size()",
                                                         (int *)local_108,(int *)&local_110);
                                              iVar2 = local_f8[0];
                                              if (local_f8[0] == (internal)0x0) {
                                                testing::Message::Message((Message *)local_108);
                                                if (local_f0 ==
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                }
                                                else {
                                                  pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                }
                                                testing::internal::AssertHelper::AssertHelper
                                                          (&local_110,kFatalFailure,
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x763,pcVar22);
                                                testing::internal::AssertHelper::operator=
                                                          (&local_110,(Message *)local_108);
                                                testing::internal::AssertHelper::~AssertHelper
                                                          (&local_110);
                                                if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                  (**(code **)(*(long *)local_108 + 8))();
                                                }
                                              }
                                              if (local_f0 !=
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                std::
                                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                              }
                                              if (iVar2 != (internal)0x0) {
                                                local_108._0_4_ = 2;
                                                local_110.data_._0_4_ =
                                                     *(float *)((long)&message->field_0 + 0x1f0);
                                                testing::internal::CmpHelperEQ<int,int>
                                                          ((internal *)local_f8,"2",
                                                           "message.repeated_string_piece_size()",
                                                           (int *)local_108,(int *)&local_110);
                                                iVar2 = local_f8[0];
                                                if (local_f8[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)local_108);
                                                  if (local_f0 ==
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x766,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                }
                                                if (local_f0 !=
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                }
                                                if (iVar2 != (internal)0x0) {
                                                  local_108._0_4_ = 2;
                                                  local_110.data_._0_4_ =
                                                       *(float *)((long)&message->field_0 + 0x208);
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_f8,"2",
                                                             "message.repeated_cord_size()",
                                                             (int *)local_108,(int *)&local_110);
                                                  iVar2 = local_f8[0];
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x767,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  if (iVar2 != (internal)0x0) {
                                                    local_108._0_4_ = 0xc9;
                                                    piVar9 = RepeatedField<int>::Get(this,0);
                                                    local_110.data_._0_4_ = (float)*piVar9;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)local_f8,"201",
                                                               "message.repeated_int32(0)",
                                                               (int *)local_108,(int *)&local_110);
                                                    if (local_f8[0] == (internal)0x0) {
                                                      testing::Message::Message
                                                                ((Message *)local_108);
                                                      if (local_f0 ==
                                                          (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x76a,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  local_110.data_._0_4_ = 2.83062e-43;
                                                  psVar10 = (size_t *)
                                                            RepeatedField<long>::Get(this_00,0);
                                                  local_108 = (undefined1  [8])*psVar10;
                                                  testing::internal::CmpHelperEQ<int,long>
                                                            ((internal *)local_f8,"202",
                                                             "message.repeated_int64(0)",
                                                             (int *)&local_110,(long *)local_108);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x76b,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  local_108._0_4_ = 0xcb;
                                                  puVar11 = RepeatedField<unsigned_int>::Get
                                                                      (this_01,0);
                                                  local_110.data_._0_4_ = (float)*puVar11;
                                                  testing::internal::CmpHelperEQ<int,unsigned_int>
                                                            ((internal *)local_f8,"203",
                                                             "message.repeated_uint32(0)",
                                                             (int *)local_108,(uint *)&local_110);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x76c,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  local_110.data_._0_4_ = 2.85865e-43;
                                                  puVar12 = RepeatedField<unsigned_long>::Get
                                                                      (local_70,0);
                                                  local_108 = (undefined1  [8])*puVar12;
                                                  testing::internal::CmpHelperEQ<int,unsigned_long>
                                                            ((internal *)local_f8,"204",
                                                             "message.repeated_uint64(0)",
                                                             (int *)&local_110,
                                                             (unsigned_long *)local_108);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x76d,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  local_108._0_4_ = 0xcd;
                                                  piVar9 = RepeatedField<int>::Get(local_78,0);
                                                  local_110.data_._0_4_ = (float)*piVar9;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_f8,"205",
                                                             "message.repeated_sint32(0)",
                                                             (int *)local_108,(int *)&local_110);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x76e,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  local_110.data_._0_4_ = 2.88667e-43;
                                                  psVar10 = (size_t *)
                                                            RepeatedField<long>::Get(local_80,0);
                                                  local_108 = (undefined1  [8])*psVar10;
                                                  testing::internal::CmpHelperEQ<int,long>
                                                            ((internal *)local_f8,"206",
                                                             "message.repeated_sint64(0)",
                                                             (int *)&local_110,(long *)local_108);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x76f,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  local_108._0_4_ = 0xcf;
                                                  puVar11 = RepeatedField<unsigned_int>::Get
                                                                      (local_88,0);
                                                  local_110.data_._0_4_ = (float)*puVar11;
                                                  testing::internal::CmpHelperEQ<int,unsigned_int>
                                                            ((internal *)local_f8,"207",
                                                             "message.repeated_fixed32(0)",
                                                             (int *)local_108,(uint *)&local_110);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x770,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  local_110.data_._0_4_ = 2.9147e-43;
                                                  puVar12 = RepeatedField<unsigned_long>::Get
                                                                      (local_90,0);
                                                  local_108 = (undefined1  [8])*puVar12;
                                                  testing::internal::CmpHelperEQ<int,unsigned_long>
                                                            ((internal *)local_f8,"208",
                                                             "message.repeated_fixed64(0)",
                                                             (int *)&local_110,
                                                             (unsigned_long *)local_108);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x771,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  local_108._0_4_ = 0xd1;
                                                  piVar9 = RepeatedField<int>::Get(local_98,0);
                                                  local_110.data_._0_4_ = (float)*piVar9;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_f8,"209",
                                                             "message.repeated_sfixed32(0)",
                                                             (int *)local_108,(int *)&local_110);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x772,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  local_110.data_._0_4_ = 2.94273e-43;
                                                  psVar10 = (size_t *)
                                                            RepeatedField<long>::Get(local_a0,0);
                                                  local_108 = (undefined1  [8])*psVar10;
                                                  testing::internal::CmpHelperEQ<int,long>
                                                            ((internal *)local_f8,"210",
                                                             "message.repeated_sfixed64(0)",
                                                             (int *)&local_110,(long *)local_108);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x773,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  local_108._0_4_ = 0xd3;
                                                  pfVar13 = RepeatedField<float>::Get(local_a8,0);
                                                  local_110.data_._0_4_ = *pfVar13;
                                                  testing::internal::CmpHelperEQ<int,float>
                                                            ((internal *)local_f8,"211",
                                                             "message.repeated_float(0)",
                                                             (int *)local_108,(float *)&local_110);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x774,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  local_110.data_._0_4_ = 2.97075e-43;
                                                  pdVar14 = RepeatedField<double>::Get(local_b0,0);
                                                  local_108 = (undefined1  [8])*pdVar14;
                                                  testing::internal::CmpHelperEQ<int,double>
                                                            ((internal *)local_f8,"212",
                                                             "message.repeated_double(0)",
                                                             (int *)&local_110,(double *)local_108);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x775,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  pbVar15 = RepeatedField<bool>::Get(local_b8,0);
                                                  local_108[0] = *pbVar15;
                                                  local_100 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  if (*pbVar15 == false) {
                                                    testing::Message::Message((Message *)&local_110)
                                                    ;
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)local_f8,
                                                               (internal *)local_108,
                                                               (AssertionResult *)
                                                               "message.repeated_bool(0)","false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_d8,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x776,(char *)CONCAT71(local_f8._1_7_,local_f8[0]
                                                                         ));
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_d8,(Message *)&local_110);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_d8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]) !=
                                                  &local_e8) {
                                                    operator_delete((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]),
                                                  local_e8._M_allocated_capacity + 1);
                                                  }
                                                  if ((long *)CONCAT44(local_110.data_._4_4_,
                                                                       local_110.data_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(local_110.data_.
                                                                                   _4_4_,local_110.
                                                                                         data_._0_4_
                                                                                  ) + 8))();
                                                  }
                                                  }
                                                  if (local_100 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)(local_108 + 8),local_100);
                                                  }
                                                  local_38 = &(message->field_0)._impl_.
                                                              repeated_string_.
                                                              super_RepeatedPtrFieldBase;
                                                  pVVar16 = protobuf::internal::RepeatedPtrFieldBase
                                                            ::
                                                  Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                                                            (local_38,0);
                                                  local_100 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(pVVar16->_M_dataplus)._M_p;
                                                  local_108 = (undefined1  [8])
                                                              pVVar16->_M_string_length;
                                                  testing::internal::
                                                  CmpHelperEQ<char[4],std::basic_string_view<char,std::char_traits<char>>>
                                                            ((internal *)local_f8,"\"215\"",
                                                             "message.repeated_string(0)",
                                                             (char (*) [4])"215",
                                                             (
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )local_108);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x777,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  local_40 = &(message->field_0)._impl_.
                                                              repeated_bytes_.
                                                              super_RepeatedPtrFieldBase;
                                                  pVVar16 = protobuf::internal::RepeatedPtrFieldBase
                                                            ::
                                                  Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                                                            (local_40,0);
                                                  local_100 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(pVVar16->_M_dataplus)._M_p;
                                                  local_108 = (undefined1  [8])
                                                              pVVar16->_M_string_length;
                                                  testing::internal::
                                                  CmpHelperEQ<char[4],std::basic_string_view<char,std::char_traits<char>>>
                                                            ((internal *)local_f8,"\"216\"",
                                                             "message.repeated_bytes(0)",
                                                             (char (*) [4])"216",
                                                             (
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )local_108);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x778,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  local_108._0_4_ = 0xd9;
                                                  local_48 = &(message->field_0)._impl_.
                                                              repeatedgroup_.
                                                              super_RepeatedPtrFieldBase;
                                                  pVVar17 = protobuf::internal::RepeatedPtrFieldBase
                                                            ::
                                                  Get<google::protobuf::internal::GenericTypeHandler<edition_unittest::TestAllTypes_RepeatedGroup>>
                                                            (local_48,0);
                                                  local_110.data_._0_4_ =
                                                       (float)(pVVar17->field_0)._impl_.a_;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_f8,"217",
                                                             "message.repeatedgroup(0).a()",
                                                             (int *)local_108,(int *)&local_110);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x77a,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  local_108._0_4_ = 0xda;
                                                  local_50 = &(message->field_0)._impl_.
                                                              repeated_nested_message_.
                                                              super_RepeatedPtrFieldBase;
                                                  pVVar18 = protobuf::internal::RepeatedPtrFieldBase
                                                            ::
                                                  Get<google::protobuf::internal::GenericTypeHandler<edition_unittest::TestAllTypes_NestedMessage>>
                                                            (local_50,0);
                                                  local_110.data_._0_4_ =
                                                       (float)(pVVar18->field_0)._impl_.bb_;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_f8,"218",
                                                                                                                          
                                                  "message.repeated_nested_message(0).bb()",
                                                  (int *)local_108,(int *)&local_110);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x77b,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  local_108._0_4_ = 0xdb;
                                                  local_58 = &(message->field_0)._impl_.
                                                              repeated_foreign_message_.
                                                              super_RepeatedPtrFieldBase;
                                                  pVVar19 = protobuf::internal::RepeatedPtrFieldBase
                                                            ::
                                                  Get<google::protobuf::internal::GenericTypeHandler<edition_unittest::ForeignMessage>>
                                                            (local_58,0);
                                                  local_110.data_._0_4_ =
                                                       (float)(pVVar19->field_0)._impl_.c_;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_f8,"219",
                                                                                                                          
                                                  "message.repeated_foreign_message(0).c()",
                                                  (int *)local_108,(int *)&local_110);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x77c,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  local_108._0_4_ = 0xdc;
                                                  local_60 = &(message->field_0)._impl_.
                                                              repeated_import_message_.
                                                              super_RepeatedPtrFieldBase;
                                                  pVVar20 = protobuf::internal::RepeatedPtrFieldBase
                                                            ::
                                                  Get<google::protobuf::internal::GenericTypeHandler<proto2_unittest_import::ImportMessage>>
                                                            (local_60,0);
                                                  local_110.data_._0_4_ =
                                                       (float)(pVVar20->field_0)._impl_.d_;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_f8,"220",
                                                                                                                          
                                                  "message.repeated_import_message(0).d()",
                                                  (int *)local_108,(int *)&local_110);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x77d,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  local_108._0_4_ = 0xe3;
                                                  local_68 = &(message->field_0)._impl_.
                                                              repeated_lazy_message_.
                                                              super_RepeatedPtrFieldBase;
                                                  pVVar18 = protobuf::internal::RepeatedPtrFieldBase
                                                            ::
                                                  Get<google::protobuf::internal::GenericTypeHandler<edition_unittest::TestAllTypes_NestedMessage>>
                                                            (local_68,0);
                                                  local_110.data_._0_4_ =
                                                       (float)(pVVar18->field_0)._impl_.bb_;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_f8,"227",
                                                             "message.repeated_lazy_message(0).bb()"
                                                             ,(int *)local_108,(int *)&local_110);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x77e,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  piVar9 = RepeatedField<int>::Get(local_c0,0);
                                                  local_108._0_4_ = *piVar9;
                                                  testing::internal::
                                                  CmpHelperEQ<edition_unittest::TestAllTypes_NestedEnum,edition_unittest::TestAllTypes_NestedEnum>
                                                            ((internal *)local_f8,
                                                             "TestAllTypes::BAR",
                                                             "message.repeated_nested_enum(0)",
                                                             &edition_unittest::TestAllTypes::BAR,
                                                             (TestAllTypes_NestedEnum *)local_108);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x781,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  local_108._0_4_ = 5;
                                                  piVar9 = RepeatedField<int>::Get(local_c8,0);
                                                  local_110.data_._0_4_ = (float)*piVar9;
                                                  testing::internal::
                                                  CmpHelperEQ<edition_unittest::ForeignEnum,edition_unittest::ForeignEnum>
                                                            ((internal *)local_f8,
                                                                                                                          
                                                  "ForeignEnum<TestAllTypes>::FOREIGN_BAR",
                                                  "message.repeated_foreign_enum(0)",
                                                  (ForeignEnum *)local_108,(ForeignEnum *)&local_110
                                                  );
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x783,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  local_108._0_4_ = 8;
                                                  piVar9 = RepeatedField<int>::Get(local_d0,0);
                                                  local_110.data_._0_4_ = (float)*piVar9;
                                                  testing::internal::
                                                  CmpHelperEQ<proto2_unittest_import::ImportEnum,proto2_unittest_import::ImportEnum>
                                                            ((internal *)local_f8,
                                                             "ImportEnum<TestAllTypes>::IMPORT_BAR",
                                                             "message.repeated_import_enum(0)",
                                                             (ImportEnum *)local_108,
                                                             (ImportEnum *)&local_110);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x785,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  local_108._0_4_ = 0x12d;
                                                  piVar9 = RepeatedField<int>::Get(this,1);
                                                  local_110.data_._0_4_ = (float)*piVar9;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_f8,"301",
                                                             "message.repeated_int32(1)",
                                                             (int *)local_108,(int *)&local_110);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x787,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  local_110.data_._0_4_ = 4.23192e-43;
                                                  psVar10 = (size_t *)
                                                            RepeatedField<long>::Get(this_00,1);
                                                  local_108 = (undefined1  [8])*psVar10;
                                                  testing::internal::CmpHelperEQ<int,long>
                                                            ((internal *)local_f8,"302",
                                                             "message.repeated_int64(1)",
                                                             (int *)&local_110,(long *)local_108);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x788,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  local_108._0_4_ = 0x12f;
                                                  puVar11 = RepeatedField<unsigned_int>::Get
                                                                      (this_01,1);
                                                  local_110.data_._0_4_ = (float)*puVar11;
                                                  testing::internal::CmpHelperEQ<int,unsigned_int>
                                                            ((internal *)local_f8,"303",
                                                             "message.repeated_uint32(1)",
                                                             (int *)local_108,(uint *)&local_110);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x789,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  local_110.data_._0_4_ = 4.25995e-43;
                                                  puVar12 = RepeatedField<unsigned_long>::Get
                                                                      (local_70,1);
                                                  local_108 = (undefined1  [8])*puVar12;
                                                  testing::internal::CmpHelperEQ<int,unsigned_long>
                                                            ((internal *)local_f8,"304",
                                                             "message.repeated_uint64(1)",
                                                             (int *)&local_110,
                                                             (unsigned_long *)local_108);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x78a,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  local_108._0_4_ = 0x131;
                                                  piVar9 = RepeatedField<int>::Get(local_78,1);
                                                  local_110.data_._0_4_ = (float)*piVar9;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_f8,"305",
                                                             "message.repeated_sint32(1)",
                                                             (int *)local_108,(int *)&local_110);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x78b,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  local_110.data_._0_4_ = 4.28797e-43;
                                                  psVar10 = (size_t *)
                                                            RepeatedField<long>::Get(local_80,1);
                                                  local_108 = (undefined1  [8])*psVar10;
                                                  testing::internal::CmpHelperEQ<int,long>
                                                            ((internal *)local_f8,"306",
                                                             "message.repeated_sint64(1)",
                                                             (int *)&local_110,(long *)local_108);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x78c,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  local_108._0_4_ = 0x133;
                                                  puVar11 = RepeatedField<unsigned_int>::Get
                                                                      (local_88,1);
                                                  local_110.data_._0_4_ = (float)*puVar11;
                                                  testing::internal::CmpHelperEQ<int,unsigned_int>
                                                            ((internal *)local_f8,"307",
                                                             "message.repeated_fixed32(1)",
                                                             (int *)local_108,(uint *)&local_110);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x78d,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  local_110.data_._0_4_ = 4.316e-43;
                                                  puVar12 = RepeatedField<unsigned_long>::Get
                                                                      (local_90,1);
                                                  local_108 = (undefined1  [8])*puVar12;
                                                  testing::internal::CmpHelperEQ<int,unsigned_long>
                                                            ((internal *)local_f8,"308",
                                                             "message.repeated_fixed64(1)",
                                                             (int *)&local_110,
                                                             (unsigned_long *)local_108);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x78e,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  local_108._0_4_ = 0x135;
                                                  piVar9 = RepeatedField<int>::Get(local_98,1);
                                                  local_110.data_._0_4_ = (float)*piVar9;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_f8,"309",
                                                             "message.repeated_sfixed32(1)",
                                                             (int *)local_108,(int *)&local_110);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x78f,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  local_110.data_._0_4_ = 4.34403e-43;
                                                  psVar10 = (size_t *)
                                                            RepeatedField<long>::Get(local_a0,1);
                                                  local_108 = (undefined1  [8])*psVar10;
                                                  testing::internal::CmpHelperEQ<int,long>
                                                            ((internal *)local_f8,"310",
                                                             "message.repeated_sfixed64(1)",
                                                             (int *)&local_110,(long *)local_108);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x790,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  local_108._0_4_ = 0x137;
                                                  pfVar13 = RepeatedField<float>::Get(local_a8,1);
                                                  local_110.data_._0_4_ = *pfVar13;
                                                  testing::internal::CmpHelperEQ<int,float>
                                                            ((internal *)local_f8,"311",
                                                             "message.repeated_float(1)",
                                                             (int *)local_108,(float *)&local_110);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x791,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  local_110.data_._0_4_ = 4.37205e-43;
                                                  pdVar14 = RepeatedField<double>::Get(local_b0,1);
                                                  local_108 = (undefined1  [8])*pdVar14;
                                                  testing::internal::CmpHelperEQ<int,double>
                                                            ((internal *)local_f8,"312",
                                                             "message.repeated_double(1)",
                                                             (int *)&local_110,(double *)local_108);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x792,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  pbVar15 = RepeatedField<bool>::Get(local_b8,1);
                                                  local_108[0] = *pbVar15 ^ 1;
                                                  local_100 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  if (*pbVar15 == true) {
                                                    testing::Message::Message((Message *)&local_110)
                                                    ;
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)local_f8,
                                                               (internal *)local_108,
                                                               (AssertionResult *)
                                                               "message.repeated_bool(1)","true",
                                                               "false",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_d8,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x793,(char *)CONCAT71(local_f8._1_7_,local_f8[0]
                                                                         ));
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_d8,(Message *)&local_110);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_d8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]) !=
                                                  &local_e8) {
                                                    operator_delete((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]),
                                                  local_e8._M_allocated_capacity + 1);
                                                  }
                                                  if ((long *)CONCAT44(local_110.data_._4_4_,
                                                                       local_110.data_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(local_110.data_.
                                                                                   _4_4_,local_110.
                                                                                         data_._0_4_
                                                                                  ) + 8))();
                                                  }
                                                  }
                                                  if (local_100 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)(local_108 + 8),local_100);
                                                  }
                                                  pVVar16 = protobuf::internal::RepeatedPtrFieldBase
                                                            ::
                                                  Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                                                            (local_38,1);
                                                  local_100 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(pVVar16->_M_dataplus)._M_p;
                                                  local_108 = (undefined1  [8])
                                                              pVVar16->_M_string_length;
                                                  testing::internal::
                                                  CmpHelperEQ<char[4],std::basic_string_view<char,std::char_traits<char>>>
                                                            ((internal *)local_f8,"\"315\"",
                                                             "message.repeated_string(1)",
                                                             (char (*) [4])"315",
                                                             (
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )local_108);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x794,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  pVVar16 = protobuf::internal::RepeatedPtrFieldBase
                                                            ::
                                                  Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                                                            (local_40,1);
                                                  local_100 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(pVVar16->_M_dataplus)._M_p;
                                                  local_108 = (undefined1  [8])
                                                              pVVar16->_M_string_length;
                                                  testing::internal::
                                                  CmpHelperEQ<char[4],std::basic_string_view<char,std::char_traits<char>>>
                                                            ((internal *)local_f8,"\"316\"",
                                                             "message.repeated_bytes(1)",
                                                             (char (*) [4])"316",
                                                             (
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )local_108);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x795,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  local_108._0_4_ = 0x13d;
                                                  pVVar17 = protobuf::internal::RepeatedPtrFieldBase
                                                            ::
                                                  Get<google::protobuf::internal::GenericTypeHandler<edition_unittest::TestAllTypes_RepeatedGroup>>
                                                            (local_48,1);
                                                  local_110.data_._0_4_ =
                                                       (float)(pVVar17->field_0)._impl_.a_;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_f8,"317",
                                                             "message.repeatedgroup(1).a()",
                                                             (int *)local_108,(int *)&local_110);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x797,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  local_108._0_4_ = 0x13e;
                                                  pVVar18 = protobuf::internal::RepeatedPtrFieldBase
                                                            ::
                                                  Get<google::protobuf::internal::GenericTypeHandler<edition_unittest::TestAllTypes_NestedMessage>>
                                                            (local_50,1);
                                                  local_110.data_._0_4_ =
                                                       (float)(pVVar18->field_0)._impl_.bb_;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_f8,"318",
                                                                                                                          
                                                  "message.repeated_nested_message(1).bb()",
                                                  (int *)local_108,(int *)&local_110);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x798,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  local_108._0_4_ = 0x13f;
                                                  pVVar19 = protobuf::internal::RepeatedPtrFieldBase
                                                            ::
                                                  Get<google::protobuf::internal::GenericTypeHandler<edition_unittest::ForeignMessage>>
                                                            (local_58,1);
                                                  local_110.data_._0_4_ =
                                                       (float)(pVVar19->field_0)._impl_.c_;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_f8,"319",
                                                                                                                          
                                                  "message.repeated_foreign_message(1).c()",
                                                  (int *)local_108,(int *)&local_110);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x799,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  local_108._0_4_ = 0x140;
                                                  pVVar20 = protobuf::internal::RepeatedPtrFieldBase
                                                            ::
                                                  Get<google::protobuf::internal::GenericTypeHandler<proto2_unittest_import::ImportMessage>>
                                                            (local_60,1);
                                                  local_110.data_._0_4_ =
                                                       (float)(pVVar20->field_0)._impl_.d_;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_f8,"320",
                                                                                                                          
                                                  "message.repeated_import_message(1).d()",
                                                  (int *)local_108,(int *)&local_110);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x79a,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  local_108._0_4_ = 0x147;
                                                  pVVar18 = protobuf::internal::RepeatedPtrFieldBase
                                                            ::
                                                  Get<google::protobuf::internal::GenericTypeHandler<edition_unittest::TestAllTypes_NestedMessage>>
                                                            (local_68,1);
                                                  local_110.data_._0_4_ =
                                                       (float)(pVVar18->field_0)._impl_.bb_;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_f8,"327",
                                                             "message.repeated_lazy_message(1).bb()"
                                                             ,(int *)local_108,(int *)&local_110);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x79b,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  piVar9 = RepeatedField<int>::Get(local_c0,1);
                                                  local_108._0_4_ = *piVar9;
                                                  testing::internal::
                                                  CmpHelperEQ<edition_unittest::TestAllTypes_NestedEnum,edition_unittest::TestAllTypes_NestedEnum>
                                                            ((internal *)local_f8,
                                                             "TestAllTypes::BAZ",
                                                             "message.repeated_nested_enum(1)",
                                                             &edition_unittest::TestAllTypes::BAZ,
                                                             (TestAllTypes_NestedEnum *)local_108);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x79d,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  local_108._0_4_ = 6;
                                                  piVar9 = RepeatedField<int>::Get(local_c8,1);
                                                  local_110.data_._0_4_ = (float)*piVar9;
                                                  testing::internal::
                                                  CmpHelperEQ<edition_unittest::ForeignEnum,edition_unittest::ForeignEnum>
                                                            ((internal *)local_f8,
                                                                                                                          
                                                  "ForeignEnum<TestAllTypes>::FOREIGN_BAZ",
                                                  "message.repeated_foreign_enum(1)",
                                                  (ForeignEnum *)local_108,(ForeignEnum *)&local_110
                                                  );
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x79f,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  local_108._0_4_ = 9;
                                                  piVar9 = RepeatedField<int>::Get(local_d0,1);
                                                  local_110.data_._0_4_ = (float)*piVar9;
                                                  testing::internal::
                                                  CmpHelperEQ<proto2_unittest_import::ImportEnum,proto2_unittest_import::ImportEnum>
                                                            ((internal *)local_f8,
                                                             "ImportEnum<TestAllTypes>::IMPORT_BAZ",
                                                             "message.repeated_import_enum(1)",
                                                             (ImportEnum *)local_108,
                                                             (ImportEnum *)&local_110);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7a1,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  uVar4 = (message->field_0)._impl_._has_bits_.
                                                          has_bits_[1] & 2;
                                                  local_108[0] = (char)(uVar4 >> 1);
                                                  local_100 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  if (uVar4 == 0) {
                                                    testing::Message::Message((Message *)&local_110)
                                                    ;
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)local_f8,
                                                               (internal *)local_108,
                                                               (AssertionResult *)
                                                               "message.has_default_int32()","false"
                                                               ,"true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_d8,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7a6,(char *)CONCAT71(local_f8._1_7_,local_f8[0]
                                                                         ));
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_d8,(Message *)&local_110);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_d8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]) !=
                                                  &local_e8) {
                                                    operator_delete((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]),
                                                  local_e8._M_allocated_capacity + 1);
                                                  }
                                                  if ((long *)CONCAT44(local_110.data_._4_4_,
                                                                       local_110.data_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(local_110.data_.
                                                                                   _4_4_,local_110.
                                                                                         data_._0_4_
                                                                                  ) + 8))();
                                                  }
                                                  }
                                                  if (local_100 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)(local_108 + 8),local_100);
                                                  }
                                                  bVar3 = *(byte *)((long)&message->field_0 + 4) & 1
                                                  ;
                                                  local_108[0] = bVar3;
                                                  local_100 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  if (bVar3 == 0) {
                                                    testing::Message::Message((Message *)&local_110)
                                                    ;
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)local_f8,
                                                               (internal *)local_108,
                                                               (AssertionResult *)
                                                               "message.has_default_int64()","false"
                                                               ,"true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_d8,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7a7,(char *)CONCAT71(local_f8._1_7_,local_f8[0]
                                                                         ));
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_d8,(Message *)&local_110);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_d8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]) !=
                                                  &local_e8) {
                                                    operator_delete((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]),
                                                  local_e8._M_allocated_capacity + 1);
                                                  }
                                                  if ((long *)CONCAT44(local_110.data_._4_4_,
                                                                       local_110.data_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(local_110.data_.
                                                                                   _4_4_,local_110.
                                                                                         data_._0_4_
                                                                                  ) + 8))();
                                                  }
                                                  }
                                                  if (local_100 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)(local_108 + 8),local_100);
                                                  }
                                                  uVar4 = (message->field_0)._impl_._has_bits_.
                                                          has_bits_[1] & 4;
                                                  local_108[0] = (char)(uVar4 >> 2);
                                                  local_100 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  if (uVar4 == 0) {
                                                    testing::Message::Message((Message *)&local_110)
                                                    ;
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)local_f8,
                                                               (internal *)local_108,
                                                               (AssertionResult *)
                                                               "message.has_default_uint32()",
                                                               "false","true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_d8,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7a8,(char *)CONCAT71(local_f8._1_7_,local_f8[0]
                                                                         ));
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_d8,(Message *)&local_110);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_d8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]) !=
                                                  &local_e8) {
                                                    operator_delete((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]),
                                                  local_e8._M_allocated_capacity + 1);
                                                  }
                                                  if ((long *)CONCAT44(local_110.data_._4_4_,
                                                                       local_110.data_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(local_110.data_.
                                                                                   _4_4_,local_110.
                                                                                         data_._0_4_
                                                                                  ) + 8))();
                                                  }
                                                  }
                                                  if (local_100 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)(local_108 + 8),local_100);
                                                  }
                                                  uVar4 = (message->field_0)._impl_._has_bits_.
                                                          has_bits_[1] & 8;
                                                  local_108[0] = (char)(uVar4 >> 3);
                                                  local_100 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  if (uVar4 == 0) {
                                                    testing::Message::Message((Message *)&local_110)
                                                    ;
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)local_f8,
                                                               (internal *)local_108,
                                                               (AssertionResult *)
                                                               "message.has_default_uint64()",
                                                               "false","true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_d8,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7a9,(char *)CONCAT71(local_f8._1_7_,local_f8[0]
                                                                         ));
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_d8,(Message *)&local_110);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_d8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]) !=
                                                  &local_e8) {
                                                    operator_delete((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]),
                                                  local_e8._M_allocated_capacity + 1);
                                                  }
                                                  if ((long *)CONCAT44(local_110.data_._4_4_,
                                                                       local_110.data_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(local_110.data_.
                                                                                   _4_4_,local_110.
                                                                                         data_._0_4_
                                                                                  ) + 8))();
                                                  }
                                                  }
                                                  if (local_100 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)(local_108 + 8),local_100);
                                                  }
                                                  uVar4 = (message->field_0)._impl_._has_bits_.
                                                          has_bits_[1] & 0x20;
                                                  local_108[0] = (char)(uVar4 >> 5);
                                                  local_100 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  if (uVar4 == 0) {
                                                    testing::Message::Message((Message *)&local_110)
                                                    ;
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)local_f8,
                                                               (internal *)local_108,
                                                               (AssertionResult *)
                                                               "message.has_default_sint32()",
                                                               "false","true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_d8,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7aa,(char *)CONCAT71(local_f8._1_7_,local_f8[0]
                                                                         ));
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_d8,(Message *)&local_110);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_d8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]) !=
                                                  &local_e8) {
                                                    operator_delete((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]),
                                                  local_e8._M_allocated_capacity + 1);
                                                  }
                                                  if ((long *)CONCAT44(local_110.data_._4_4_,
                                                                       local_110.data_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(local_110.data_.
                                                                                   _4_4_,local_110.
                                                                                         data_._0_4_
                                                                                  ) + 8))();
                                                  }
                                                  }
                                                  if (local_100 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)(local_108 + 8),local_100);
                                                  }
                                                  uVar4 = (message->field_0)._impl_._has_bits_.
                                                          has_bits_[1] & 0x10;
                                                  local_108[0] = (char)(uVar4 >> 4);
                                                  local_100 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  if (uVar4 == 0) {
                                                    testing::Message::Message((Message *)&local_110)
                                                    ;
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)local_f8,
                                                               (internal *)local_108,
                                                               (AssertionResult *)
                                                               "message.has_default_sint64()",
                                                               "false","true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_d8,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7ab,(char *)CONCAT71(local_f8._1_7_,local_f8[0]
                                                                         ));
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_d8,(Message *)&local_110);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_d8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]) !=
                                                  &local_e8) {
                                                    operator_delete((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]),
                                                  local_e8._M_allocated_capacity + 1);
                                                  }
                                                  if ((long *)CONCAT44(local_110.data_._4_4_,
                                                                       local_110.data_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(local_110.data_.
                                                                                   _4_4_,local_110.
                                                                                         data_._0_4_
                                                                                  ) + 8))();
                                                  }
                                                  }
                                                  if (local_100 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)(local_108 + 8),local_100);
                                                  }
                                                  uVar4 = (message->field_0)._impl_._has_bits_.
                                                          has_bits_[1] & 0x40;
                                                  local_108[0] = (char)(uVar4 >> 6);
                                                  local_100 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  if (uVar4 == 0) {
                                                    testing::Message::Message((Message *)&local_110)
                                                    ;
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)local_f8,
                                                               (internal *)local_108,
                                                               (AssertionResult *)
                                                               "message.has_default_fixed32()",
                                                               "false","true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_d8,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7ac,(char *)CONCAT71(local_f8._1_7_,local_f8[0]
                                                                         ));
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_d8,(Message *)&local_110);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_d8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]) !=
                                                  &local_e8) {
                                                    operator_delete((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]),
                                                  local_e8._M_allocated_capacity + 1);
                                                  }
                                                  if ((long *)CONCAT44(local_110.data_._4_4_,
                                                                       local_110.data_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(local_110.data_.
                                                                                   _4_4_,local_110.
                                                                                         data_._0_4_
                                                                                  ) + 8))();
                                                  }
                                                  }
                                                  if (local_100 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)(local_108 + 8),local_100);
                                                  }
                                                  bVar3 = *(byte *)((long)&message->field_0 + 4);
                                                  local_108[0] = bVar3 >> 7;
                                                  local_100 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  if (-1 < (char)bVar3) {
                                                    testing::Message::Message((Message *)&local_110)
                                                    ;
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)local_f8,
                                                               (internal *)local_108,
                                                               (AssertionResult *)
                                                               "message.has_default_fixed64()",
                                                               "false","true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_d8,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7ad,(char *)CONCAT71(local_f8._1_7_,local_f8[0]
                                                                         ));
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_d8,(Message *)&local_110);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_d8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]) !=
                                                  &local_e8) {
                                                    operator_delete((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]),
                                                  local_e8._M_allocated_capacity + 1);
                                                  }
                                                  if ((long *)CONCAT44(local_110.data_._4_4_,
                                                                       local_110.data_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(local_110.data_.
                                                                                   _4_4_,local_110.
                                                                                         data_._0_4_
                                                                                  ) + 8))();
                                                  }
                                                  }
                                                  if (local_100 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)(local_108 + 8),local_100);
                                                  }
                                                  uVar4 = (message->field_0)._impl_._has_bits_.
                                                          has_bits_[1] & 0x200;
                                                  local_108[0] = (char)(uVar4 >> 9);
                                                  local_100 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  if (uVar4 == 0) {
                                                    testing::Message::Message((Message *)&local_110)
                                                    ;
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)local_f8,
                                                               (internal *)local_108,
                                                               (AssertionResult *)
                                                               "message.has_default_sfixed32()",
                                                               "false","true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_d8,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7ae,(char *)CONCAT71(local_f8._1_7_,local_f8[0]
                                                                         ));
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_d8,(Message *)&local_110);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_d8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]) !=
                                                  &local_e8) {
                                                    operator_delete((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]),
                                                  local_e8._M_allocated_capacity + 1);
                                                  }
                                                  if ((long *)CONCAT44(local_110.data_._4_4_,
                                                                       local_110.data_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(local_110.data_.
                                                                                   _4_4_,local_110.
                                                                                         data_._0_4_
                                                                                  ) + 8))();
                                                  }
                                                  }
                                                  if (local_100 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)(local_108 + 8),local_100);
                                                  }
                                                  uVar4 = (message->field_0)._impl_._has_bits_.
                                                          has_bits_[1] & 0x100;
                                                  local_108[0] = (char)(uVar4 >> 8);
                                                  local_100 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  if (uVar4 == 0) {
                                                    testing::Message::Message((Message *)&local_110)
                                                    ;
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)local_f8,
                                                               (internal *)local_108,
                                                               (AssertionResult *)
                                                               "message.has_default_sfixed64()",
                                                               "false","true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_d8,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7af,(char *)CONCAT71(local_f8._1_7_,local_f8[0]
                                                                         ));
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_d8,(Message *)&local_110);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_d8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]) !=
                                                  &local_e8) {
                                                    operator_delete((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]),
                                                  local_e8._M_allocated_capacity + 1);
                                                  }
                                                  if ((long *)CONCAT44(local_110.data_._4_4_,
                                                                       local_110.data_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(local_110.data_.
                                                                                   _4_4_,local_110.
                                                                                         data_._0_4_
                                                                                  ) + 8))();
                                                  }
                                                  }
                                                  if (local_100 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)(local_108 + 8),local_100);
                                                  }
                                                  uVar4 = (message->field_0)._impl_._has_bits_.
                                                          has_bits_[1] & 0x400;
                                                  local_108[0] = (char)(uVar4 >> 10);
                                                  local_100 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  if (uVar4 == 0) {
                                                    testing::Message::Message((Message *)&local_110)
                                                    ;
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)local_f8,
                                                               (internal *)local_108,
                                                               (AssertionResult *)
                                                               "message.has_default_float()","false"
                                                               ,"true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_d8,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7b0,(char *)CONCAT71(local_f8._1_7_,local_f8[0]
                                                                         ));
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_d8,(Message *)&local_110);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_d8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]) !=
                                                  &local_e8) {
                                                    operator_delete((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]),
                                                  local_e8._M_allocated_capacity + 1);
                                                  }
                                                  if ((long *)CONCAT44(local_110.data_._4_4_,
                                                                       local_110.data_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(local_110.data_.
                                                                                   _4_4_,local_110.
                                                                                         data_._0_4_
                                                                                  ) + 8))();
                                                  }
                                                  }
                                                  if (local_100 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)(local_108 + 8),local_100);
                                                  }
                                                  uVar4 = (message->field_0)._impl_._has_bits_.
                                                          has_bits_[1] & 0x800;
                                                  local_108[0] = (char)(uVar4 >> 0xb);
                                                  local_100 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  if (uVar4 == 0) {
                                                    testing::Message::Message((Message *)&local_110)
                                                    ;
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)local_f8,
                                                               (internal *)local_108,
                                                               (AssertionResult *)
                                                               "message.has_default_double()",
                                                               "false","true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_d8,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7b1,(char *)CONCAT71(local_f8._1_7_,local_f8[0]
                                                                         ));
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_d8,(Message *)&local_110);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_d8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]) !=
                                                  &local_e8) {
                                                    operator_delete((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]),
                                                  local_e8._M_allocated_capacity + 1);
                                                  }
                                                  if ((long *)CONCAT44(local_110.data_._4_4_,
                                                                       local_110.data_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(local_110.data_.
                                                                                   _4_4_,local_110.
                                                                                         data_._0_4_
                                                                                  ) + 8))();
                                                  }
                                                  }
                                                  if (local_100 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)(local_108 + 8),local_100);
                                                  }
                                                  uVar4 = (message->field_0)._impl_._has_bits_.
                                                          has_bits_[1] & 0x1000;
                                                  local_108[0] = (char)(uVar4 >> 0xc);
                                                  local_100 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  if (uVar4 == 0) {
                                                    testing::Message::Message((Message *)&local_110)
                                                    ;
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)local_f8,
                                                               (internal *)local_108,
                                                               (AssertionResult *)
                                                               "message.has_default_bool()","false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_d8,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7b2,(char *)CONCAT71(local_f8._1_7_,local_f8[0]
                                                                         ));
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_d8,(Message *)&local_110);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_d8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]) !=
                                                  &local_e8) {
                                                    operator_delete((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]),
                                                  local_e8._M_allocated_capacity + 1);
                                                  }
                                                  if ((long *)CONCAT44(local_110.data_._4_4_,
                                                                       local_110.data_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(local_110.data_.
                                                                                   _4_4_,local_110.
                                                                                         data_._0_4_
                                                                                  ) + 8))();
                                                  }
                                                  }
                                                  if (local_100 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)(local_108 + 8),local_100);
                                                  }
                                                  uVar4 = (message->field_0)._impl_._has_bits_.
                                                          has_bits_[0] & 0x8000000;
                                                  local_108[0] = (byte)(uVar4 >> 0x1b);
                                                  local_100 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  if (uVar4 == 0) {
                                                    testing::Message::Message((Message *)&local_110)
                                                    ;
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)local_f8,
                                                               (internal *)local_108,
                                                               (AssertionResult *)
                                                               "message.has_default_string()",
                                                               "false","true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_d8,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7b3,(char *)CONCAT71(local_f8._1_7_,local_f8[0]
                                                                         ));
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_d8,(Message *)&local_110);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_d8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]) !=
                                                  &local_e8) {
                                                    operator_delete((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]),
                                                  local_e8._M_allocated_capacity + 1);
                                                  }
                                                  if ((long *)CONCAT44(local_110.data_._4_4_,
                                                                       local_110.data_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(local_110.data_.
                                                                                   _4_4_,local_110.
                                                                                         data_._0_4_
                                                                                  ) + 8))();
                                                  }
                                                  }
                                                  if (local_100 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)(local_108 + 8),local_100);
                                                  }
                                                  uVar4 = (message->field_0)._impl_._has_bits_.
                                                          has_bits_[0] & 0x10000000;
                                                  local_108[0] = (byte)(uVar4 >> 0x1c);
                                                  local_100 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  if (uVar4 == 0) {
                                                    testing::Message::Message((Message *)&local_110)
                                                    ;
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)local_f8,
                                                               (internal *)local_108,
                                                               (AssertionResult *)
                                                               "message.has_default_bytes()","false"
                                                               ,"true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_d8,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7b4,(char *)CONCAT71(local_f8._1_7_,local_f8[0]
                                                                         ));
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_d8,(Message *)&local_110);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_d8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]) !=
                                                  &local_e8) {
                                                    operator_delete((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]),
                                                  local_e8._M_allocated_capacity + 1);
                                                  }
                                                  if ((long *)CONCAT44(local_110.data_._4_4_,
                                                                       local_110.data_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(local_110.data_.
                                                                                   _4_4_,local_110.
                                                                                         data_._0_4_
                                                                                  ) + 8))();
                                                  }
                                                  }
                                                  if (local_100 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)(local_108 + 8),local_100);
                                                  }
                                                  uVar4 = (message->field_0)._impl_._has_bits_.
                                                          has_bits_[1] & 0x2000;
                                                  local_108[0] = (char)(uVar4 >> 0xd);
                                                  local_100 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  if (uVar4 == 0) {
                                                    testing::Message::Message((Message *)&local_110)
                                                    ;
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)local_f8,
                                                               (internal *)local_108,
                                                               (AssertionResult *)
                                                               "message.has_default_nested_enum()",
                                                               "false","true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_d8,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7b6,(char *)CONCAT71(local_f8._1_7_,local_f8[0]
                                                                         ));
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_d8,(Message *)&local_110);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_d8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]) !=
                                                  &local_e8) {
                                                    operator_delete((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]),
                                                  local_e8._M_allocated_capacity + 1);
                                                  }
                                                  if ((long *)CONCAT44(local_110.data_._4_4_,
                                                                       local_110.data_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(local_110.data_.
                                                                                   _4_4_,local_110.
                                                                                         data_._0_4_
                                                                                  ) + 8))();
                                                  }
                                                  }
                                                  if (local_100 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)(local_108 + 8),local_100);
                                                  }
                                                  uVar4 = (message->field_0)._impl_._has_bits_.
                                                          has_bits_[1] & 0x4000;
                                                  local_108[0] = (char)(uVar4 >> 0xe);
                                                  local_100 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  if (uVar4 == 0) {
                                                    testing::Message::Message((Message *)&local_110)
                                                    ;
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)local_f8,
                                                               (internal *)local_108,
                                                               (AssertionResult *)
                                                               "message.has_default_foreign_enum()",
                                                               "false","true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_d8,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7b7,(char *)CONCAT71(local_f8._1_7_,local_f8[0]
                                                                         ));
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_d8,(Message *)&local_110);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_d8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]) !=
                                                  &local_e8) {
                                                    operator_delete((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]),
                                                  local_e8._M_allocated_capacity + 1);
                                                  }
                                                  if ((long *)CONCAT44(local_110.data_._4_4_,
                                                                       local_110.data_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(local_110.data_.
                                                                                   _4_4_,local_110.
                                                                                         data_._0_4_
                                                                                  ) + 8))();
                                                  }
                                                  }
                                                  if (local_100 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)(local_108 + 8),local_100);
                                                  }
                                                  uVar4 = (message->field_0)._impl_._has_bits_.
                                                          has_bits_[1] & 0x8000;
                                                  local_108[0] = (char)(uVar4 >> 0xf);
                                                  local_100 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  if (uVar4 == 0) {
                                                    testing::Message::Message((Message *)&local_110)
                                                    ;
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)local_f8,
                                                               (internal *)local_108,
                                                               (AssertionResult *)
                                                               "message.has_default_import_enum()",
                                                               "false","true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_d8,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7b8,(char *)CONCAT71(local_f8._1_7_,local_f8[0]
                                                                         ));
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_d8,(Message *)&local_110);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_d8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]) !=
                                                  &local_e8) {
                                                    operator_delete((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]),
                                                  local_e8._M_allocated_capacity + 1);
                                                  }
                                                  if ((long *)CONCAT44(local_110.data_._4_4_,
                                                                       local_110.data_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(local_110.data_.
                                                                                   _4_4_,local_110.
                                                                                         data_._0_4_
                                                                                  ) + 8))();
                                                  }
                                                  }
                                                  if (local_100 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)(local_108 + 8),local_100);
                                                  }
                                                  local_108._0_4_ = 0x191;
                                                  local_110.data_._0_4_ =
                                                       (float)(message->field_0)._impl_.
                                                              default_int32_;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_f8,"401",
                                                             "message.default_int32()",
                                                             (int *)local_108,(int *)&local_110);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7bb,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  local_110.data_._0_4_ = 5.63322e-43;
                                                  local_108 = (undefined1  [8])
                                                              (message->field_0)._impl_.
                                                              default_int64_;
                                                  testing::internal::CmpHelperEQ<int,long>
                                                            ((internal *)local_f8,"402",
                                                             "message.default_int64()",
                                                             (int *)&local_110,(long *)local_108);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7bc,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  local_108._0_4_ = 0x193;
                                                  local_110.data_._0_4_ =
                                                       (float)(message->field_0)._impl_.
                                                              default_uint32_;
                                                  testing::internal::CmpHelperEQ<int,unsigned_int>
                                                            ((internal *)local_f8,"403",
                                                             "message.default_uint32()",
                                                             (int *)local_108,(uint *)&local_110);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7bd,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  local_110.data_._0_4_ = 5.66125e-43;
                                                  local_108 = (undefined1  [8])
                                                              (message->field_0)._impl_.
                                                              default_uint64_;
                                                  testing::internal::CmpHelperEQ<int,unsigned_long>
                                                            ((internal *)local_f8,"404",
                                                             "message.default_uint64()",
                                                             (int *)&local_110,
                                                             (unsigned_long *)local_108);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7be,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  local_108._0_4_ = 0x195;
                                                  local_110.data_._0_4_ =
                                                       (float)(message->field_0)._impl_.
                                                              default_sint32_;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_f8,"405",
                                                             "message.default_sint32()",
                                                             (int *)local_108,(int *)&local_110);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7bf,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  local_110.data_._0_4_ = 5.68927e-43;
                                                  local_108 = (undefined1  [8])
                                                              (message->field_0)._impl_.
                                                              default_sint64_;
                                                  testing::internal::CmpHelperEQ<int,long>
                                                            ((internal *)local_f8,"406",
                                                             "message.default_sint64()",
                                                             (int *)&local_110,(long *)local_108);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7c0,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  local_108._0_4_ = 0x197;
                                                  local_110.data_._0_4_ =
                                                       (float)(message->field_0)._impl_.
                                                              default_fixed32_;
                                                  testing::internal::CmpHelperEQ<int,unsigned_int>
                                                            ((internal *)local_f8,"407",
                                                             "message.default_fixed32()",
                                                             (int *)local_108,(uint *)&local_110);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7c1,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  local_110.data_._0_4_ = 5.7173e-43;
                                                  local_108 = (undefined1  [8])
                                                              (message->field_0)._impl_.
                                                              default_fixed64_;
                                                  testing::internal::CmpHelperEQ<int,unsigned_long>
                                                            ((internal *)local_f8,"408",
                                                             "message.default_fixed64()",
                                                             (int *)&local_110,
                                                             (unsigned_long *)local_108);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7c2,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  local_108._0_4_ = 0x199;
                                                  local_110.data_._0_4_ =
                                                       (float)(message->field_0)._impl_.
                                                              default_sfixed32_;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)local_f8,"409",
                                                             "message.default_sfixed32()",
                                                             (int *)local_108,(int *)&local_110);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7c3,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  local_110.data_._0_4_ = 5.74532e-43;
                                                  local_108 = (undefined1  [8])
                                                              (message->field_0)._impl_.
                                                              default_sfixed64_;
                                                  testing::internal::CmpHelperEQ<int,long>
                                                            ((internal *)local_f8,"410",
                                                             "message.default_sfixed64()",
                                                             (int *)&local_110,(long *)local_108);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7c4,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  local_108._0_4_ = 0x19b;
                                                  local_110.data_._0_4_ =
                                                       (message->field_0)._impl_.default_float_;
                                                  testing::internal::CmpHelperEQ<int,float>
                                                            ((internal *)local_f8,"411",
                                                             "message.default_float()",
                                                             (int *)local_108,(float *)&local_110);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7c5,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  local_110.data_._0_4_ = 5.77335e-43;
                                                  local_108 = (undefined1  [8])
                                                              (message->field_0)._impl_.
                                                              default_double_;
                                                  testing::internal::CmpHelperEQ<int,double>
                                                            ((internal *)local_f8,"412",
                                                             "message.default_double()",
                                                             (int *)&local_110,(double *)local_108);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7c6,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  bVar23 = (message->field_0)._impl_.default_bool_;
                                                  local_108[0] = bVar23 ^ 1;
                                                  local_100 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  if (bVar23 == true) {
                                                    testing::Message::Message((Message *)&local_110)
                                                    ;
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)local_f8,
                                                               (internal *)local_108,
                                                               (AssertionResult *)
                                                               "message.default_bool()","true",
                                                               "false",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_d8,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7c7,(char *)CONCAT71(local_f8._1_7_,local_f8[0]
                                                                         ));
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_d8,(Message *)&local_110);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_d8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]) !=
                                                  &local_e8) {
                                                    operator_delete((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]),
                                                  local_e8._M_allocated_capacity + 1);
                                                  }
                                                  if ((long *)CONCAT44(local_110.data_._4_4_,
                                                                       local_110.data_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(local_110.data_.
                                                                                   _4_4_,local_110.
                                                                                         data_._0_4_
                                                                                  ) + 8))();
                                                  }
                                                  }
                                                  if (local_100 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)(local_108 + 8),local_100);
                                                  }
                                                  _local_108 = edition_unittest::TestAllTypes::
                                                               default_string(message);
                                                  testing::internal::
                                                  CmpHelperEQ<char[4],std::basic_string_view<char,std::char_traits<char>>>
                                                            ((internal *)local_f8,"\"415\"",
                                                             "message.default_string()",
                                                             (char (*) [4])"415",
                                                             (
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )local_108);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7c8,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  _local_108 = edition_unittest::TestAllTypes::
                                                               default_bytes(message);
                                                  testing::internal::
                                                  CmpHelperEQ<char[4],std::basic_string_view<char,std::char_traits<char>>>
                                                            ((internal *)local_f8,"\"416\"",
                                                             "message.default_bytes()",
                                                             (char (*) [4])0x11d50ea,
                                                             (
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )local_108);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7c9,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  local_108._0_4_ =
                                                       (message->field_0)._impl_.
                                                       default_nested_enum_;
                                                  testing::internal::
                                                  CmpHelperEQ<edition_unittest::TestAllTypes_NestedEnum,edition_unittest::TestAllTypes_NestedEnum>
                                                            ((internal *)local_f8,
                                                             "TestAllTypes::FOO",
                                                             "message.default_nested_enum()",
                                                             &edition_unittest::TestAllTypes::FOO,
                                                             (TestAllTypes_NestedEnum *)local_108);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7cb,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  local_108._0_4_ = 4;
                                                  local_110.data_._0_4_ =
                                                       (float)(message->field_0)._impl_.
                                                              default_foreign_enum_;
                                                  testing::internal::
                                                  CmpHelperEQ<edition_unittest::ForeignEnum,edition_unittest::ForeignEnum>
                                                            ((internal *)local_f8,
                                                                                                                          
                                                  "ForeignEnum<TestAllTypes>::FOREIGN_FOO",
                                                  "message.default_foreign_enum()",
                                                  (ForeignEnum *)local_108,(ForeignEnum *)&local_110
                                                  );
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7cd,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  local_108._0_4_ = 7;
                                                  local_110.data_._0_4_ =
                                                       (float)(message->field_0)._impl_.
                                                              default_import_enum_;
                                                  testing::internal::
                                                  CmpHelperEQ<proto2_unittest_import::ImportEnum,proto2_unittest_import::ImportEnum>
                                                            ((internal *)local_f8,
                                                             "ImportEnum<TestAllTypes>::IMPORT_FOO",
                                                             "message.default_import_enum()",
                                                             (ImportEnum *)local_108,
                                                             (ImportEnum *)&local_110);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,1999,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  bVar23 = (message->field_0)._impl_._oneof_case_[0]
                                                           != 0x6f;
                                                  local_108[0] = bVar23;
                                                  local_100 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  if (!bVar23) {
                                                    testing::Message::Message((Message *)&local_110)
                                                    ;
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)local_f8,
                                                               (internal *)local_108,
                                                               (AssertionResult *)
                                                               "message.has_oneof_uint32()","true",
                                                               "false",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_d8,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7d2,(char *)CONCAT71(local_f8._1_7_,local_f8[0]
                                                                         ));
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_d8,(Message *)&local_110);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_d8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]) !=
                                                  &local_e8) {
                                                    operator_delete((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]),
                                                  local_e8._M_allocated_capacity + 1);
                                                  }
                                                  if ((long *)CONCAT44(local_110.data_._4_4_,
                                                                       local_110.data_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(local_110.data_.
                                                                                   _4_4_,local_110.
                                                                                         data_._0_4_
                                                                                  ) + 8))();
                                                  }
                                                  }
                                                  if (local_100 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)(local_108 + 8),local_100);
                                                  }
                                                  bVar23 = (message->field_0)._impl_._oneof_case_[0]
                                                           != 0x70;
                                                  local_108[0] = bVar23;
                                                  local_100 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  if (!bVar23) {
                                                    testing::Message::Message((Message *)&local_110)
                                                    ;
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)local_f8,
                                                               (internal *)local_108,
                                                               (AssertionResult *)
                                                               "message.has_oneof_nested_message()",
                                                               "true","false",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_d8,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7d3,(char *)CONCAT71(local_f8._1_7_,local_f8[0]
                                                                         ));
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_d8,(Message *)&local_110);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_d8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]) !=
                                                  &local_e8) {
                                                    operator_delete((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]),
                                                  local_e8._M_allocated_capacity + 1);
                                                  }
                                                  if ((long *)CONCAT44(local_110.data_._4_4_,
                                                                       local_110.data_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(local_110.data_.
                                                                                   _4_4_,local_110.
                                                                                         data_._0_4_
                                                                                  ) + 8))();
                                                  }
                                                  }
                                                  if (local_100 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)(local_108 + 8),local_100);
                                                  }
                                                  bVar23 = (message->field_0)._impl_._oneof_case_[0]
                                                           != 0x71;
                                                  local_108[0] = bVar23;
                                                  local_100 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  if (!bVar23) {
                                                    testing::Message::Message((Message *)&local_110)
                                                    ;
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)local_f8,
                                                               (internal *)local_108,
                                                               (AssertionResult *)
                                                               "message.has_oneof_string()","true",
                                                               "false",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_d8,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7d4,(char *)CONCAT71(local_f8._1_7_,local_f8[0]
                                                                         ));
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_d8,(Message *)&local_110);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_d8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]) !=
                                                  &local_e8) {
                                                    operator_delete((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]),
                                                  local_e8._M_allocated_capacity + 1);
                                                  }
                                                  if ((long *)CONCAT44(local_110.data_._4_4_,
                                                                       local_110.data_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(local_110.data_.
                                                                                   _4_4_,local_110.
                                                                                         data_._0_4_
                                                                                  ) + 8))();
                                                  }
                                                  }
                                                  if (local_100 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)(local_108 + 8),local_100);
                                                  }
                                                  bVar23 = (message->field_0)._impl_._oneof_case_[0]
                                                           == 0x72;
                                                  local_108[0] = bVar23;
                                                  local_100 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                                  if (!bVar23) {
                                                    testing::Message::Message((Message *)&local_110)
                                                    ;
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)local_f8,
                                                               (internal *)local_108,
                                                               (AssertionResult *)
                                                               "message.has_oneof_bytes()","false",
                                                               "true",in_R9);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_d8,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7d5,(char *)CONCAT71(local_f8._1_7_,local_f8[0]
                                                                         ));
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_d8,(Message *)&local_110);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_d8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]) !=
                                                  &local_e8) {
                                                    operator_delete((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_f8._1_7_,local_f8[0]),
                                                  local_e8._M_allocated_capacity + 1);
                                                  }
                                                  if ((long *)CONCAT44(local_110.data_._4_4_,
                                                                       local_110.data_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(local_110.data_.
                                                                                   _4_4_,local_110.
                                                                                         data_._0_4_
                                                                                  ) + 8))();
                                                  }
                                                  }
                                                  if (local_100 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)(local_108 + 8),local_100);
                                                  }
                                                  puVar21 = (undefined8 *)
                                                            ((ulong)(message->field_0)._impl_.
                                                                    oneof_field_.
                                                                    oneof_nested_message_ &
                                                            0xfffffffffffffffc);
                                                  puVar8 = &protobuf::internal::
                                                            fixed_address_empty_string;
                                                  psVar10 = &DAT_01a07360;
                                                  if ((message->field_0)._impl_._oneof_case_[0] ==
                                                      0x72) {
                                                    puVar8 = puVar21;
                                                    psVar10 = puVar21 + 1;
                                                  }
                                                  local_100 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)*puVar8;
                                                  local_108 = (undefined1  [8])*psVar10;
                                                  testing::internal::
                                                  CmpHelperEQ<char[4],std::basic_string_view<char,std::char_traits<char>>>
                                                            ((internal *)local_f8,"\"604\"",
                                                             "message.oneof_bytes()",
                                                             (char (*) [4])"604",
                                                             (
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )local_108);
                                                  if (local_f8[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)local_108);
                                                    if (local_f0 ==
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    pcVar22 = anon_var_dwarf_a12c75 + 5;
                                                  }
                                                  else {
                                                    pcVar22 = (local_f0->_M_dataplus)._M_p;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_110,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x7d7,pcVar22);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_110,(Message *)local_108);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_110);
                                                  if ((
                                                  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )local_108 !=
                                                  (
                                                  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    (**(code **)(*(long *)local_108 + 8))();
                                                  }
                                                  }
                                                  if (local_f0 !=
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0) {
                                                    std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_f0,local_f0);
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ExpectAllFieldsSet(const TestAllTypes& message) {
  EXPECT_TRUE(message.has_optional_int32());
  EXPECT_TRUE(message.has_optional_int64());
  EXPECT_TRUE(message.has_optional_uint32());
  EXPECT_TRUE(message.has_optional_uint64());
  EXPECT_TRUE(message.has_optional_sint32());
  EXPECT_TRUE(message.has_optional_sint64());
  EXPECT_TRUE(message.has_optional_fixed32());
  EXPECT_TRUE(message.has_optional_fixed64());
  EXPECT_TRUE(message.has_optional_sfixed32());
  EXPECT_TRUE(message.has_optional_sfixed64());
  EXPECT_TRUE(message.has_optional_float());
  EXPECT_TRUE(message.has_optional_double());
  EXPECT_TRUE(message.has_optional_bool());
  EXPECT_TRUE(message.has_optional_string());
  EXPECT_TRUE(message.has_optional_bytes());

  EXPECT_TRUE(message.has_optionalgroup());
  EXPECT_TRUE(message.has_optional_nested_message());
  EXPECT_TRUE(message.has_optional_foreign_message());
  EXPECT_TRUE(message.has_optional_import_message());
  EXPECT_TRUE(message.has_optional_public_import_message());
  EXPECT_TRUE(message.has_optional_lazy_message());
  EXPECT_TRUE(message.has_optional_unverified_lazy_message());

  EXPECT_TRUE(message.optionalgroup().has_a());
  EXPECT_TRUE(message.optional_nested_message().has_bb());
  EXPECT_TRUE(message.optional_foreign_message().has_c());
  EXPECT_TRUE(message.optional_import_message().has_d());
  EXPECT_TRUE(message.optional_public_import_message().has_e());
  EXPECT_TRUE(message.optional_lazy_message().has_bb());
  EXPECT_TRUE(message.optional_unverified_lazy_message().has_bb());

  EXPECT_TRUE(message.has_optional_nested_enum());
  EXPECT_TRUE(message.has_optional_foreign_enum());
  EXPECT_TRUE(message.has_optional_import_enum());

#ifndef PROTOBUF_TEST_NO_DESCRIPTORS
  EXPECT_TRUE(message.has_optional_string_piece());
  EXPECT_TRUE(message.has_optional_cord());
#endif
  EXPECT_TRUE(message.has_optional_bytes_cord());

  EXPECT_EQ(101, message.optional_int32());
  EXPECT_EQ(102, message.optional_int64());
  EXPECT_EQ(103, message.optional_uint32());
  EXPECT_EQ(104, message.optional_uint64());
  EXPECT_EQ(105, message.optional_sint32());
  EXPECT_EQ(106, message.optional_sint64());
  EXPECT_EQ(107, message.optional_fixed32());
  EXPECT_EQ(108, message.optional_fixed64());
  EXPECT_EQ(109, message.optional_sfixed32());
  EXPECT_EQ(110, message.optional_sfixed64());
  EXPECT_EQ(111, message.optional_float());
  EXPECT_EQ(112, message.optional_double());
  EXPECT_TRUE(message.optional_bool());
  EXPECT_EQ("115", message.optional_string());
  EXPECT_EQ("116", message.optional_bytes());

  EXPECT_EQ(117, message.optionalgroup().a());
  EXPECT_EQ(118, message.optional_nested_message().bb());
  EXPECT_EQ(119, message.optional_foreign_message().c());
  EXPECT_EQ(120, message.optional_import_message().d());
  EXPECT_EQ(126, message.optional_public_import_message().e());
  EXPECT_EQ(127, message.optional_lazy_message().bb());
  EXPECT_EQ(128, message.optional_unverified_lazy_message().bb());

  EXPECT_EQ(TestAllTypes::BAZ, message.optional_nested_enum());
  EXPECT_EQ(ForeignEnum<TestAllTypes>::FOREIGN_BAZ,
            message.optional_foreign_enum());
  EXPECT_EQ(ImportEnum<TestAllTypes>::IMPORT_BAZ,
            message.optional_import_enum());

  EXPECT_EQ("optional bytes cord", message.optional_bytes_cord());

  // -----------------------------------------------------------------

  ASSERT_EQ(2, message.repeated_int32_size());
  ASSERT_EQ(2, message.repeated_int64_size());
  ASSERT_EQ(2, message.repeated_uint32_size());
  ASSERT_EQ(2, message.repeated_uint64_size());
  ASSERT_EQ(2, message.repeated_sint32_size());
  ASSERT_EQ(2, message.repeated_sint64_size());
  ASSERT_EQ(2, message.repeated_fixed32_size());
  ASSERT_EQ(2, message.repeated_fixed64_size());
  ASSERT_EQ(2, message.repeated_sfixed32_size());
  ASSERT_EQ(2, message.repeated_sfixed64_size());
  ASSERT_EQ(2, message.repeated_float_size());
  ASSERT_EQ(2, message.repeated_double_size());
  ASSERT_EQ(2, message.repeated_bool_size());
  ASSERT_EQ(2, message.repeated_string_size());
  ASSERT_EQ(2, message.repeated_bytes_size());

  ASSERT_EQ(2, message.repeatedgroup_size());
  ASSERT_EQ(2, message.repeated_nested_message_size());
  ASSERT_EQ(2, message.repeated_foreign_message_size());
  ASSERT_EQ(2, message.repeated_import_message_size());
  ASSERT_EQ(2, message.repeated_lazy_message_size());
  ASSERT_EQ(2, message.repeated_nested_enum_size());
  ASSERT_EQ(2, message.repeated_foreign_enum_size());
  ASSERT_EQ(2, message.repeated_import_enum_size());

#ifndef PROTOBUF_TEST_NO_DESCRIPTORS
  ASSERT_EQ(2, message.repeated_string_piece_size());
  ASSERT_EQ(2, message.repeated_cord_size());
#endif

  EXPECT_EQ(201, message.repeated_int32(0));
  EXPECT_EQ(202, message.repeated_int64(0));
  EXPECT_EQ(203, message.repeated_uint32(0));
  EXPECT_EQ(204, message.repeated_uint64(0));
  EXPECT_EQ(205, message.repeated_sint32(0));
  EXPECT_EQ(206, message.repeated_sint64(0));
  EXPECT_EQ(207, message.repeated_fixed32(0));
  EXPECT_EQ(208, message.repeated_fixed64(0));
  EXPECT_EQ(209, message.repeated_sfixed32(0));
  EXPECT_EQ(210, message.repeated_sfixed64(0));
  EXPECT_EQ(211, message.repeated_float(0));
  EXPECT_EQ(212, message.repeated_double(0));
  EXPECT_TRUE(message.repeated_bool(0));
  EXPECT_EQ("215", message.repeated_string(0));
  EXPECT_EQ("216", message.repeated_bytes(0));

  EXPECT_EQ(217, message.repeatedgroup(0).a());
  EXPECT_EQ(218, message.repeated_nested_message(0).bb());
  EXPECT_EQ(219, message.repeated_foreign_message(0).c());
  EXPECT_EQ(220, message.repeated_import_message(0).d());
  EXPECT_EQ(227, message.repeated_lazy_message(0).bb());


  EXPECT_EQ(TestAllTypes::BAR, message.repeated_nested_enum(0));
  EXPECT_EQ(ForeignEnum<TestAllTypes>::FOREIGN_BAR,
            message.repeated_foreign_enum(0));
  EXPECT_EQ(ImportEnum<TestAllTypes>::IMPORT_BAR,
            message.repeated_import_enum(0));

  EXPECT_EQ(301, message.repeated_int32(1));
  EXPECT_EQ(302, message.repeated_int64(1));
  EXPECT_EQ(303, message.repeated_uint32(1));
  EXPECT_EQ(304, message.repeated_uint64(1));
  EXPECT_EQ(305, message.repeated_sint32(1));
  EXPECT_EQ(306, message.repeated_sint64(1));
  EXPECT_EQ(307, message.repeated_fixed32(1));
  EXPECT_EQ(308, message.repeated_fixed64(1));
  EXPECT_EQ(309, message.repeated_sfixed32(1));
  EXPECT_EQ(310, message.repeated_sfixed64(1));
  EXPECT_EQ(311, message.repeated_float(1));
  EXPECT_EQ(312, message.repeated_double(1));
  EXPECT_FALSE(message.repeated_bool(1));
  EXPECT_EQ("315", message.repeated_string(1));
  EXPECT_EQ("316", message.repeated_bytes(1));

  EXPECT_EQ(317, message.repeatedgroup(1).a());
  EXPECT_EQ(318, message.repeated_nested_message(1).bb());
  EXPECT_EQ(319, message.repeated_foreign_message(1).c());
  EXPECT_EQ(320, message.repeated_import_message(1).d());
  EXPECT_EQ(327, message.repeated_lazy_message(1).bb());

  EXPECT_EQ(TestAllTypes::BAZ, message.repeated_nested_enum(1));
  EXPECT_EQ(ForeignEnum<TestAllTypes>::FOREIGN_BAZ,
            message.repeated_foreign_enum(1));
  EXPECT_EQ(ImportEnum<TestAllTypes>::IMPORT_BAZ,
            message.repeated_import_enum(1));


  // -----------------------------------------------------------------

  EXPECT_TRUE(message.has_default_int32());
  EXPECT_TRUE(message.has_default_int64());
  EXPECT_TRUE(message.has_default_uint32());
  EXPECT_TRUE(message.has_default_uint64());
  EXPECT_TRUE(message.has_default_sint32());
  EXPECT_TRUE(message.has_default_sint64());
  EXPECT_TRUE(message.has_default_fixed32());
  EXPECT_TRUE(message.has_default_fixed64());
  EXPECT_TRUE(message.has_default_sfixed32());
  EXPECT_TRUE(message.has_default_sfixed64());
  EXPECT_TRUE(message.has_default_float());
  EXPECT_TRUE(message.has_default_double());
  EXPECT_TRUE(message.has_default_bool());
  EXPECT_TRUE(message.has_default_string());
  EXPECT_TRUE(message.has_default_bytes());

  EXPECT_TRUE(message.has_default_nested_enum());
  EXPECT_TRUE(message.has_default_foreign_enum());
  EXPECT_TRUE(message.has_default_import_enum());


  EXPECT_EQ(401, message.default_int32());
  EXPECT_EQ(402, message.default_int64());
  EXPECT_EQ(403, message.default_uint32());
  EXPECT_EQ(404, message.default_uint64());
  EXPECT_EQ(405, message.default_sint32());
  EXPECT_EQ(406, message.default_sint64());
  EXPECT_EQ(407, message.default_fixed32());
  EXPECT_EQ(408, message.default_fixed64());
  EXPECT_EQ(409, message.default_sfixed32());
  EXPECT_EQ(410, message.default_sfixed64());
  EXPECT_EQ(411, message.default_float());
  EXPECT_EQ(412, message.default_double());
  EXPECT_FALSE(message.default_bool());
  EXPECT_EQ("415", message.default_string());
  EXPECT_EQ("416", message.default_bytes());

  EXPECT_EQ(TestAllTypes::FOO, message.default_nested_enum());
  EXPECT_EQ(ForeignEnum<TestAllTypes>::FOREIGN_FOO,
            message.default_foreign_enum());
  EXPECT_EQ(ImportEnum<TestAllTypes>::IMPORT_FOO,
            message.default_import_enum());


  EXPECT_FALSE(message.has_oneof_uint32());
  EXPECT_FALSE(message.has_oneof_nested_message());
  EXPECT_FALSE(message.has_oneof_string());
  EXPECT_TRUE(message.has_oneof_bytes());

  EXPECT_EQ("604", message.oneof_bytes());
}